

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx2::CurveNiIntersectorK<4,8>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [28];
  undefined1 auVar76 [32];
  uint uVar77;
  int iVar78;
  uint uVar79;
  ulong uVar80;
  long lVar81;
  uint uVar82;
  ulong uVar83;
  long lVar84;
  float fVar85;
  undefined8 uVar86;
  float fVar105;
  vint4 bi_2;
  undefined1 auVar87 [16];
  float fVar107;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar104;
  float fVar106;
  float fVar108;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar92 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined4 uVar112;
  vint4 bi_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  float fVar131;
  float fVar132;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_2;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  float fVar161;
  undefined1 auVar157 [32];
  undefined1 auVar155 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 ai;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  vint4 bi;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar171 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined4 uVar187;
  vint4 ai_1;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 auVar200 [64];
  undefined4 uVar204;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar212;
  float fVar218;
  undefined1 auVar213 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar219 [32];
  float fVar220;
  float fVar225;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  undefined1 auVar224 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  RTCFilterFunctionNArguments local_7d0;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  RayQueryContext *local_718;
  RayHitK<8> *local_710;
  undefined1 (*local_708) [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [2] [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520;
  uint uStack_51c;
  uint uStack_518;
  uint uStack_514;
  uint uStack_510;
  uint uStack_50c;
  uint uStack_508;
  uint uStack_504;
  undefined1 local_500 [32];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  int local_380;
  int local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined4 uStack_244;
  undefined1 local_240 [32];
  undefined4 local_220;
  undefined4 uStack_21c;
  undefined4 uStack_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  uint local_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar214 [32];
  
  PVar5 = prim[1];
  uVar83 = (ulong)(byte)PVar5;
  fVar132 = *(float *)(prim + uVar83 * 0x19 + 0x12);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar11 = vsubps_avx(auVar11,*(undefined1 (*) [16])(prim + uVar83 * 0x19 + 6));
  auVar87._0_4_ = fVar132 * auVar11._0_4_;
  auVar87._4_4_ = fVar132 * auVar11._4_4_;
  auVar87._8_4_ = fVar132 * auVar11._8_4_;
  auVar87._12_4_ = fVar132 * auVar11._12_4_;
  auVar168._0_4_ = fVar132 * auVar12._0_4_;
  auVar168._4_4_ = fVar132 * auVar12._4_4_;
  auVar168._8_4_ = fVar132 * auVar12._8_4_;
  auVar168._12_4_ = fVar132 * auVar12._12_4_;
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar5 * 0xc + uVar83 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  uVar80 = (ulong)(uint)((int)(uVar83 * 9) * 2);
  auVar90 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + uVar83 + 6)));
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar80 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar133 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 + 6)));
  auVar133 = vcvtdq2ps_avx(auVar133);
  auVar221._4_4_ = auVar168._0_4_;
  auVar221._0_4_ = auVar168._0_4_;
  auVar221._8_4_ = auVar168._0_4_;
  auVar221._12_4_ = auVar168._0_4_;
  auVar114 = vshufps_avx(auVar168,auVar168,0x55);
  auVar88 = vshufps_avx(auVar168,auVar168,0xaa);
  fVar132 = auVar88._0_4_;
  auVar208._0_4_ = fVar132 * auVar13._0_4_;
  fVar131 = auVar88._4_4_;
  auVar208._4_4_ = fVar131 * auVar13._4_4_;
  fVar105 = auVar88._8_4_;
  auVar208._8_4_ = fVar105 * auVar13._8_4_;
  fVar107 = auVar88._12_4_;
  auVar208._12_4_ = fVar107 * auVar13._12_4_;
  auVar205._0_4_ = auVar16._0_4_ * fVar132;
  auVar205._4_4_ = auVar16._4_4_ * fVar131;
  auVar205._8_4_ = auVar16._8_4_ * fVar105;
  auVar205._12_4_ = auVar16._12_4_ * fVar107;
  auVar188._0_4_ = auVar133._0_4_ * fVar132;
  auVar188._4_4_ = auVar133._4_4_ * fVar131;
  auVar188._8_4_ = auVar133._8_4_ * fVar105;
  auVar188._12_4_ = auVar133._12_4_ * fVar107;
  auVar88 = vfmadd231ps_fma(auVar208,auVar114,auVar12);
  auVar115 = vfmadd231ps_fma(auVar205,auVar114,auVar15);
  auVar114 = vfmadd231ps_fma(auVar188,auVar89,auVar114);
  auVar153 = vfmadd231ps_fma(auVar88,auVar221,auVar11);
  auVar115 = vfmadd231ps_fma(auVar115,auVar221,auVar14);
  auVar163 = vfmadd231ps_fma(auVar114,auVar90,auVar221);
  auVar222._4_4_ = auVar87._0_4_;
  auVar222._0_4_ = auVar87._0_4_;
  auVar222._8_4_ = auVar87._0_4_;
  auVar222._12_4_ = auVar87._0_4_;
  auVar114 = vshufps_avx(auVar87,auVar87,0x55);
  auVar88 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar132 = auVar88._0_4_;
  auVar169._0_4_ = fVar132 * auVar13._0_4_;
  fVar131 = auVar88._4_4_;
  auVar169._4_4_ = fVar131 * auVar13._4_4_;
  fVar105 = auVar88._8_4_;
  auVar169._8_4_ = fVar105 * auVar13._8_4_;
  fVar107 = auVar88._12_4_;
  auVar169._12_4_ = fVar107 * auVar13._12_4_;
  auVar113._0_4_ = auVar16._0_4_ * fVar132;
  auVar113._4_4_ = auVar16._4_4_ * fVar131;
  auVar113._8_4_ = auVar16._8_4_ * fVar105;
  auVar113._12_4_ = auVar16._12_4_ * fVar107;
  auVar88._0_4_ = auVar133._0_4_ * fVar132;
  auVar88._4_4_ = auVar133._4_4_ * fVar131;
  auVar88._8_4_ = auVar133._8_4_ * fVar105;
  auVar88._12_4_ = auVar133._12_4_ * fVar107;
  auVar12 = vfmadd231ps_fma(auVar169,auVar114,auVar12);
  auVar13 = vfmadd231ps_fma(auVar113,auVar114,auVar15);
  auVar15 = vfmadd231ps_fma(auVar88,auVar114,auVar89);
  auVar16 = vfmadd231ps_fma(auVar12,auVar222,auVar11);
  auVar89 = vfmadd231ps_fma(auVar13,auVar222,auVar14);
  auVar133 = vfmadd231ps_fma(auVar15,auVar222,auVar90);
  local_3f0._8_4_ = 0x7fffffff;
  local_3f0._0_8_ = 0x7fffffff7fffffff;
  local_3f0._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx(auVar153,local_3f0);
  auVar162._8_4_ = 0x219392ef;
  auVar162._0_8_ = 0x219392ef219392ef;
  auVar162._12_4_ = 0x219392ef;
  auVar11 = vcmpps_avx(auVar11,auVar162,1);
  auVar12 = vblendvps_avx(auVar153,auVar162,auVar11);
  auVar11 = vandps_avx(auVar115,local_3f0);
  auVar11 = vcmpps_avx(auVar11,auVar162,1);
  auVar13 = vblendvps_avx(auVar115,auVar162,auVar11);
  auVar11 = vandps_avx(auVar163,local_3f0);
  auVar11 = vcmpps_avx(auVar11,auVar162,1);
  auVar11 = vblendvps_avx(auVar163,auVar162,auVar11);
  auVar14 = vrcpps_avx(auVar12);
  auVar184._8_4_ = 0x3f800000;
  auVar184._0_8_ = 0x3f8000003f800000;
  auVar184._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar184);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar184);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar12,auVar184);
  auVar90 = vfmadd132ps_fma(auVar11,auVar12,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar11 = vpmovsxwd_avx(auVar11);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar16);
  auVar163._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar163._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar163._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar163._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar16);
  auVar170._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar170._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar170._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar170._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar115._1_3_ = 0;
  auVar115[0] = PVar5;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar83 * -2 + 6);
  auVar11 = vpmovsxwd_avx(auVar14);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar89);
  auVar189._0_4_ = auVar11._0_4_ * auVar15._0_4_;
  auVar189._4_4_ = auVar11._4_4_ * auVar15._4_4_;
  auVar189._8_4_ = auVar11._8_4_ * auVar15._8_4_;
  auVar189._12_4_ = auVar11._12_4_ * auVar15._12_4_;
  auVar11 = vcvtdq2ps_avx(auVar12);
  auVar11 = vsubps_avx(auVar11,auVar89);
  auVar114._0_4_ = auVar15._0_4_ * auVar11._0_4_;
  auVar114._4_4_ = auVar15._4_4_ * auVar11._4_4_;
  auVar114._8_4_ = auVar15._8_4_ * auVar11._8_4_;
  auVar114._12_4_ = auVar15._12_4_ * auVar11._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar80 + uVar83 + 6);
  auVar11 = vpmovsxwd_avx(auVar15);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar133);
  auVar153._0_4_ = auVar90._0_4_ * auVar11._0_4_;
  auVar153._4_4_ = auVar90._4_4_ * auVar11._4_4_;
  auVar153._8_4_ = auVar90._8_4_ * auVar11._8_4_;
  auVar153._12_4_ = auVar90._12_4_ * auVar11._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar83 * 0x17 + 6);
  auVar11 = vpmovsxwd_avx(auVar16);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar133);
  auVar89._0_4_ = auVar90._0_4_ * auVar11._0_4_;
  auVar89._4_4_ = auVar90._4_4_ * auVar11._4_4_;
  auVar89._8_4_ = auVar90._8_4_ * auVar11._8_4_;
  auVar89._12_4_ = auVar90._12_4_ * auVar11._12_4_;
  auVar11 = vpminsd_avx(auVar163,auVar170);
  auVar12 = vpminsd_avx(auVar189,auVar114);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  auVar12 = vpminsd_avx(auVar153,auVar89);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar194._4_4_ = uVar112;
  auVar194._0_4_ = uVar112;
  auVar194._8_4_ = uVar112;
  auVar194._12_4_ = uVar112;
  auVar12 = vmaxps_avx(auVar12,auVar194);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  local_400._0_4_ = auVar11._0_4_ * 0.99999964;
  local_400._4_4_ = auVar11._4_4_ * 0.99999964;
  local_400._8_4_ = auVar11._8_4_ * 0.99999964;
  local_400._12_4_ = auVar11._12_4_ * 0.99999964;
  auVar11 = vpmaxsd_avx(auVar163,auVar170);
  auVar12 = vpmaxsd_avx(auVar189,auVar114);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar12 = vpmaxsd_avx(auVar153,auVar89);
  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar133._4_4_ = uVar112;
  auVar133._0_4_ = uVar112;
  auVar133._8_4_ = uVar112;
  auVar133._12_4_ = uVar112;
  auVar12 = vminps_avx(auVar12,auVar133);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar90._0_4_ = auVar11._0_4_ * 1.0000004;
  auVar90._4_4_ = auVar11._4_4_ * 1.0000004;
  auVar90._8_4_ = auVar11._8_4_ * 1.0000004;
  auVar90._12_4_ = auVar11._12_4_ * 1.0000004;
  auVar115[4] = PVar5;
  auVar115._5_3_ = 0;
  auVar115[8] = PVar5;
  auVar115._9_3_ = 0;
  auVar115[0xc] = PVar5;
  auVar115._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar115,_DAT_01f7fcf0);
  auVar11 = vcmpps_avx(local_400,auVar90,2);
  auVar11 = vandps_avx(auVar11,auVar12);
  uVar77 = vmovmskps_avx(auVar11);
  if (uVar77 != 0) {
    uVar77 = uVar77 & 0xff;
    local_660[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_660[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_660[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_660[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_708 = (undefined1 (*) [32])&local_140;
    iVar78 = 1 << ((uint)k & 0x1f);
    auVar101._4_4_ = iVar78;
    auVar101._0_4_ = iVar78;
    auVar101._8_4_ = iVar78;
    auVar101._12_4_ = iVar78;
    auVar101._16_4_ = iVar78;
    auVar101._20_4_ = iVar78;
    auVar101._24_4_ = iVar78;
    auVar101._28_4_ = iVar78;
    auVar146 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar101 = vpand_avx2(auVar101,auVar146);
    local_2a0 = vpcmpeqd_avx2(auVar101,auVar146);
    do {
      lVar20 = 0;
      for (uVar80 = (ulong)uVar77; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
        lVar20 = lVar20 + 1;
      }
      uVar6 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar20 * 4 + 6);
      pGVar8 = (context->scene->geometries).items[uVar6].ptr;
      uVar80 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                               (ulong)uVar7 *
                               pGVar8[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      lVar84 = (long)pGVar8[1].intersectionFilterN * uVar80;
      lVar81 = (long)pGVar8[1].intersectionFilterN * (uVar80 + 1);
      lVar20 = *(long *)&pGVar8[1].time_range.upper;
      auVar11 = *(undefined1 (*) [16])(lVar20 + lVar84);
      auVar12 = *(undefined1 (*) [16])(lVar20 + lVar81);
      uVar112 = *(undefined4 *)(lVar20 + 0xc + lVar84);
      auVar185._4_4_ = uVar112;
      auVar185._0_4_ = uVar112;
      auVar185._8_4_ = uVar112;
      auVar185._12_4_ = uVar112;
      local_240._16_4_ = uVar112;
      local_240._0_16_ = auVar185;
      local_240._20_4_ = uVar112;
      local_240._24_4_ = uVar112;
      local_240._28_4_ = uVar112;
      iVar78 = (int)pGVar8[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar132 = *(float *)(lVar20 + 0xc + lVar81);
      auVar223._4_4_ = fVar132;
      auVar223._0_4_ = fVar132;
      auVar223._8_4_ = fVar132;
      auVar223._12_4_ = fVar132;
      fStack_250 = fVar132;
      _local_260 = auVar223;
      fStack_24c = fVar132;
      fStack_248 = fVar132;
      uStack_244 = fVar132;
      lVar20 = (long)iVar78 * 0x44;
      auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar116._8_4_ = 0xbeaaaaab;
      auVar116._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar116._12_4_ = 0xbeaaaaab;
      auVar153 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                   (pGVar8[2].intersectionFilterN +
                                   uVar80 * (long)pGVar8[2].pointQueryFunc),auVar11,auVar116);
      auVar89 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (pGVar8[2].intersectionFilterN +
                                 (long)pGVar8[2].pointQueryFunc * (uVar80 + 1)),auVar12,auVar116);
      auVar15 = vsubps_avx(auVar11,auVar13);
      uVar112 = auVar15._0_4_;
      auVar134._4_4_ = uVar112;
      auVar134._0_4_ = uVar112;
      auVar134._8_4_ = uVar112;
      auVar134._12_4_ = uVar112;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar131 = pre->ray_space[k].vz.field_0.m128[0];
      fVar105 = pre->ray_space[k].vz.field_0.m128[1];
      fVar107 = pre->ray_space[k].vz.field_0.m128[2];
      fVar201 = pre->ray_space[k].vz.field_0.m128[3];
      auVar190._0_4_ = fVar131 * auVar15._0_4_;
      auVar190._4_4_ = fVar105 * auVar15._4_4_;
      auVar190._8_4_ = fVar107 * auVar15._8_4_;
      auVar190._12_4_ = fVar201 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar4,auVar14);
      auVar133 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar134);
      auVar16 = vinsertps_avx(auVar133,auVar185,0x30);
      auVar15 = vsubps_avx(auVar153,auVar13);
      uVar112 = auVar15._0_4_;
      auVar154._4_4_ = uVar112;
      auVar154._0_4_ = uVar112;
      auVar154._8_4_ = uVar112;
      auVar154._12_4_ = uVar112;
      auVar14 = vshufps_avx(auVar15,auVar15,0x55);
      auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
      auVar206._0_4_ = fVar131 * auVar15._0_4_;
      auVar206._4_4_ = fVar105 * auVar15._4_4_;
      auVar206._8_4_ = fVar107 * auVar15._8_4_;
      auVar206._12_4_ = fVar201 * auVar15._12_4_;
      auVar14 = vfmadd231ps_fma(auVar206,(undefined1  [16])aVar4,auVar14);
      auVar114 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar3,auVar154);
      auVar90 = vsubps_avx(auVar89,auVar13);
      auVar14 = vshufps_avx(auVar90,auVar90,0x55);
      auVar15 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar186._0_4_ = fVar131 * auVar15._0_4_;
      auVar186._4_4_ = fVar105 * auVar15._4_4_;
      auVar186._8_4_ = fVar107 * auVar15._8_4_;
      auVar186._12_4_ = fVar201 * auVar15._12_4_;
      auVar15 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar4,auVar14);
      auVar14 = vblendps_avx(auVar114,auVar153,8);
      auVar135._0_4_ = auVar90._0_4_;
      auVar135._4_4_ = auVar135._0_4_;
      auVar135._8_4_ = auVar135._0_4_;
      auVar135._12_4_ = auVar135._0_4_;
      auVar88 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar3,auVar135);
      auVar90 = vsubps_avx(auVar12,auVar13);
      auVar13 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar213._0_4_ = fVar131 * auVar13._0_4_;
      auVar213._4_4_ = fVar105 * auVar13._4_4_;
      auVar213._8_4_ = fVar107 * auVar13._8_4_;
      auVar213._12_4_ = fVar201 * auVar13._12_4_;
      auVar13 = vshufps_avx(auVar90,auVar90,0x55);
      auVar13 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar4,auVar13);
      auVar15 = vblendps_avx(auVar88,auVar89,8);
      auVar91._0_4_ = auVar90._0_4_;
      auVar91._4_4_ = auVar91._0_4_;
      auVar91._8_4_ = auVar91._0_4_;
      auVar91._12_4_ = auVar91._0_4_;
      auVar115 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar3,auVar91);
      auVar90 = vinsertps_avx(auVar115,auVar223,0x30);
      auVar13 = vandps_avx(auVar16,local_3f0);
      auVar14 = vandps_avx(auVar14,local_3f0);
      auVar16 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vandps_avx(auVar15,local_3f0);
      auVar14 = vandps_avx(auVar90,local_3f0);
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar16,auVar13);
      auVar14 = vmovshdup_avx(auVar13);
      auVar14 = vmaxss_avx(auVar14,auVar13);
      auVar13 = vshufpd_avx(auVar13,auVar13,1);
      auVar13 = vmaxss_avx(auVar13,auVar14);
      auVar14 = vmovshdup_avx(auVar133);
      uVar86 = auVar14._0_8_;
      local_620._8_8_ = uVar86;
      local_620._0_8_ = uVar86;
      local_620._16_8_ = uVar86;
      local_620._24_8_ = uVar86;
      auVar14 = vmovshdup_avx(auVar114);
      uVar86 = auVar14._0_8_;
      local_500._8_8_ = uVar86;
      local_500._0_8_ = uVar86;
      local_500._16_8_ = uVar86;
      local_500._24_8_ = uVar86;
      auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x908);
      auVar14 = vmovshdup_avx(auVar88);
      uVar86 = auVar14._0_8_;
      local_700._8_8_ = uVar86;
      local_700._0_8_ = uVar86;
      local_700._16_8_ = uVar86;
      local_700._24_8_ = uVar86;
      auVar14 = vmovshdup_avx(auVar115);
      local_6a0 = auVar14._0_8_;
      uVar112 = auVar88._0_4_;
      local_740._4_4_ = uVar112;
      local_740._0_4_ = uVar112;
      local_740._8_4_ = uVar112;
      local_740._12_4_ = uVar112;
      local_740._16_4_ = uVar112;
      local_740._20_4_ = uVar112;
      local_740._24_4_ = uVar112;
      local_740._28_4_ = uVar112;
      fVar107 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0xd8c);
      fVar201 = *(float *)(bezier_basis0 + lVar20 + 0xd90);
      fVar202 = *(float *)(bezier_basis0 + lVar20 + 0xd94);
      fVar203 = *(float *)(bezier_basis0 + lVar20 + 0xd98);
      fVar161 = *(float *)(bezier_basis0 + lVar20 + 0xd9c);
      fVar71 = *(float *)(bezier_basis0 + lVar20 + 0xda0);
      fVar72 = *(float *)(bezier_basis0 + lVar20 + 0xda4);
      auVar75 = *(undefined1 (*) [28])(bezier_basis0 + lVar20 + 0xd8c);
      local_4e0 = auVar115._0_4_;
      auVar157._0_4_ = fVar107 * local_4e0;
      auVar157._4_4_ = fVar201 * local_4e0;
      auVar157._8_4_ = fVar202 * local_4e0;
      auVar157._12_4_ = fVar203 * local_4e0;
      auVar157._16_4_ = fVar161 * local_4e0;
      auVar157._20_4_ = fVar71 * local_4e0;
      auVar157._24_4_ = fVar72 * local_4e0;
      auVar157._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar157,auVar101,local_740);
      fVar131 = auVar14._0_4_;
      auVar146._0_4_ = fVar107 * fVar131;
      fVar105 = auVar14._4_4_;
      auVar146._4_4_ = fVar201 * fVar105;
      auVar146._8_4_ = fVar202 * fVar131;
      auVar146._12_4_ = fVar203 * fVar105;
      auVar146._16_4_ = fVar161 * fVar131;
      auVar146._20_4_ = fVar71 * fVar105;
      auVar146._24_4_ = fVar72 * fVar131;
      auVar146._28_4_ = 0;
      auVar14 = vfmadd231ps_fma(auVar146,auVar101,local_700);
      auVar146 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x484);
      uVar204 = auVar114._0_4_;
      auVar182._4_4_ = uVar204;
      auVar182._0_4_ = uVar204;
      auVar182._8_4_ = uVar204;
      auVar182._12_4_ = uVar204;
      auVar182._16_4_ = uVar204;
      auVar182._20_4_ = uVar204;
      auVar182._24_4_ = uVar204;
      auVar182._28_4_ = uVar204;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar146,auVar182);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,local_500);
      auVar157 = *(undefined1 (*) [32])(bezier_basis0 + lVar20);
      uVar187 = auVar133._0_4_;
      auVar175._4_4_ = uVar187;
      auVar175._0_4_ = uVar187;
      auVar175._8_4_ = uVar187;
      auVar175._12_4_ = uVar187;
      auVar175._16_4_ = uVar187;
      auVar175._20_4_ = uVar187;
      auVar175._24_4_ = uVar187;
      auVar175._28_4_ = uVar187;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar157,auVar175);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar157,local_620);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x908);
      fVar85 = *(float *)(bezier_basis1 + lVar20 + 0xd8c);
      fVar104 = *(float *)(bezier_basis1 + lVar20 + 0xd90);
      fVar106 = *(float *)(bezier_basis1 + lVar20 + 0xd94);
      fVar108 = *(float *)(bezier_basis1 + lVar20 + 0xd98);
      fVar109 = *(float *)(bezier_basis1 + lVar20 + 0xd9c);
      fVar110 = *(float *)(bezier_basis1 + lVar20 + 0xda0);
      fVar111 = *(float *)(bezier_basis1 + lVar20 + 0xda4);
      auVar121._4_4_ = fVar104 * local_4e0;
      auVar121._0_4_ = fVar85 * local_4e0;
      auVar121._8_4_ = fVar106 * local_4e0;
      auVar121._12_4_ = fVar108 * local_4e0;
      auVar121._16_4_ = fVar109 * local_4e0;
      auVar121._20_4_ = fVar110 * local_4e0;
      auVar121._24_4_ = fVar111 * local_4e0;
      auVar121._28_4_ = local_4e0;
      auVar16 = vfmadd231ps_fma(auVar121,auVar100,local_740);
      auVar199._4_4_ = fVar104 * fVar105;
      auVar199._0_4_ = fVar85 * fVar131;
      auVar199._8_4_ = fVar106 * fVar131;
      auVar199._12_4_ = fVar108 * fVar105;
      auVar199._16_4_ = fVar109 * fVar131;
      auVar199._20_4_ = fVar110 * fVar105;
      auVar199._24_4_ = fVar111 * fVar131;
      auVar199._28_4_ = uVar112;
      auVar90 = vfmadd231ps_fma(auVar199,auVar100,local_700);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x484);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,auVar182);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar121,local_500);
      auVar199 = *(undefined1 (*) [32])(bezier_basis1 + lVar20);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar199,auVar175);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar199,local_620);
      auVar93 = ZEXT1632(auVar16);
      local_440 = ZEXT1632(auVar15);
      auVar149 = vsubps_avx(auVar93,local_440);
      local_560 = ZEXT1632(auVar90);
      _local_580 = ZEXT1632(auVar14);
      auVar17 = vsubps_avx(local_560,_local_580);
      auVar94._0_4_ = auVar14._0_4_ * auVar149._0_4_;
      auVar94._4_4_ = auVar14._4_4_ * auVar149._4_4_;
      auVar94._8_4_ = auVar14._8_4_ * auVar149._8_4_;
      auVar94._12_4_ = auVar14._12_4_ * auVar149._12_4_;
      auVar94._16_4_ = auVar149._16_4_ * 0.0;
      auVar94._20_4_ = auVar149._20_4_ * 0.0;
      auVar94._24_4_ = auVar149._24_4_ * 0.0;
      auVar94._28_4_ = 0;
      fVar220 = auVar17._0_4_;
      auVar117._0_4_ = fVar220 * auVar15._0_4_;
      fVar225 = auVar17._4_4_;
      auVar117._4_4_ = fVar225 * auVar15._4_4_;
      fVar212 = auVar17._8_4_;
      auVar117._8_4_ = fVar212 * auVar15._8_4_;
      fVar218 = auVar17._12_4_;
      auVar117._12_4_ = fVar218 * auVar15._12_4_;
      fVar226 = auVar17._16_4_;
      auVar117._16_4_ = fVar226 * 0.0;
      fVar227 = auVar17._20_4_;
      auVar117._20_4_ = fVar227 * 0.0;
      fVar228 = auVar17._24_4_;
      auVar117._24_4_ = fVar228 * 0.0;
      auVar117._28_4_ = 0;
      auVar94 = vsubps_avx(auVar94,auVar117);
      auVar181 = ZEXT3264(auVar94);
      auVar14 = vpermilps_avx(auVar153,0xff);
      uVar86 = auVar14._0_8_;
      local_80._8_8_ = uVar86;
      local_80._0_8_ = uVar86;
      local_80._16_8_ = uVar86;
      local_80._24_8_ = uVar86;
      auVar15 = vpermilps_avx(auVar89,0xff);
      local_a0._0_8_ = auVar15._0_8_;
      local_a0._8_8_ = local_a0._0_8_;
      local_a0._16_8_ = local_a0._0_8_;
      local_a0._24_8_ = local_a0._0_8_;
      auVar195._4_4_ = fVar201 * fVar132;
      auVar195._0_4_ = fVar107 * fVar132;
      auVar195._8_4_ = fVar202 * fVar132;
      auVar195._12_4_ = fVar203 * fVar132;
      auVar195._16_4_ = fVar161 * fVar132;
      auVar195._20_4_ = fVar71 * fVar132;
      auVar195._24_4_ = fVar72 * fVar132;
      auVar195._28_4_ = *(undefined4 *)(bezier_basis0 + lVar20 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar195,local_a0,auVar101);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar146,local_80);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar157,local_240);
      auVar10._4_4_ = fVar104 * fVar132;
      auVar10._0_4_ = fVar85 * fVar132;
      auVar10._8_4_ = fVar106 * fVar132;
      auVar10._12_4_ = fVar108 * fVar132;
      auVar10._16_4_ = fVar109 * fVar132;
      auVar10._20_4_ = fVar110 * fVar132;
      auVar10._24_4_ = fVar111 * fVar132;
      auVar10._28_4_ = auVar157._28_4_;
      auVar16 = vfmadd231ps_fma(auVar10,auVar100,local_a0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,local_80);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar199,local_240);
      auVar177._4_4_ = fVar225 * fVar225;
      auVar177._0_4_ = fVar220 * fVar220;
      auVar177._8_4_ = fVar212 * fVar212;
      auVar177._12_4_ = fVar218 * fVar218;
      auVar177._16_4_ = fVar226 * fVar226;
      auVar177._20_4_ = fVar227 * fVar227;
      auVar177._24_4_ = fVar228 * fVar228;
      auVar177._28_4_ = auVar14._4_4_;
      auVar14 = vfmadd231ps_fma(auVar177,auVar149,auVar149);
      auVar195 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar18._4_4_ = auVar195._4_4_ * auVar195._4_4_ * auVar14._4_4_;
      auVar18._0_4_ = auVar195._0_4_ * auVar195._0_4_ * auVar14._0_4_;
      auVar18._8_4_ = auVar195._8_4_ * auVar195._8_4_ * auVar14._8_4_;
      auVar18._12_4_ = auVar195._12_4_ * auVar195._12_4_ * auVar14._12_4_;
      auVar18._16_4_ = auVar195._16_4_ * auVar195._16_4_ * 0.0;
      auVar18._20_4_ = auVar195._20_4_ * auVar195._20_4_ * 0.0;
      auVar18._24_4_ = auVar195._24_4_ * auVar195._24_4_ * 0.0;
      auVar18._28_4_ = auVar195._28_4_;
      auVar19._4_4_ = auVar94._4_4_ * auVar94._4_4_;
      auVar19._0_4_ = auVar94._0_4_ * auVar94._0_4_;
      auVar19._8_4_ = auVar94._8_4_ * auVar94._8_4_;
      auVar19._12_4_ = auVar94._12_4_ * auVar94._12_4_;
      auVar19._16_4_ = auVar94._16_4_ * auVar94._16_4_;
      auVar19._20_4_ = auVar94._20_4_ * auVar94._20_4_;
      auVar19._24_4_ = auVar94._24_4_ * auVar94._24_4_;
      auVar19._28_4_ = 0;
      auVar195 = vcmpps_avx(auVar19,auVar18,2);
      fVar132 = auVar13._0_4_ * 4.7683716e-07;
      auVar95._0_4_ = (float)iVar78;
      uStack_51c = auVar115._4_4_;
      uStack_518 = auVar115._8_4_;
      uStack_514 = auVar115._12_4_;
      auVar95._4_4_ = auVar95._0_4_;
      auVar95._8_4_ = auVar95._0_4_;
      auVar95._12_4_ = auVar95._0_4_;
      auVar95._16_4_ = auVar95._0_4_;
      auVar95._20_4_ = auVar95._0_4_;
      auVar95._24_4_ = auVar95._0_4_;
      auVar95._28_4_ = auVar95._0_4_;
      auVar10 = vcmpps_avx(_DAT_01faff40,auVar95,1);
      auVar13 = vpermilps_avx(auVar133,0xaa);
      uVar86 = auVar13._0_8_;
      auVar191._8_8_ = uVar86;
      auVar191._0_8_ = uVar86;
      auVar191._16_8_ = uVar86;
      auVar191._24_8_ = uVar86;
      auVar14 = vpermilps_avx(auVar114,0xaa);
      uVar86 = auVar14._0_8_;
      auVar207._8_8_ = uVar86;
      auVar207._0_8_ = uVar86;
      auVar207._16_8_ = uVar86;
      auVar207._24_8_ = uVar86;
      auVar13 = vpermilps_avx(auVar88,0xaa);
      uVar86 = auVar13._0_8_;
      local_420._8_8_ = uVar86;
      local_420._0_8_ = uVar86;
      local_420._16_8_ = uVar86;
      local_420._24_8_ = uVar86;
      auVar13 = vshufps_avx(auVar115,auVar115,0xaa);
      uVar86 = auVar13._0_8_;
      auVar214._8_8_ = uVar86;
      auVar214._0_8_ = uVar86;
      auVar214._16_8_ = uVar86;
      auVar214._24_8_ = uVar86;
      auVar217 = ZEXT3264(auVar214);
      auVar177 = auVar10 & auVar195;
      uVar82 = *(uint *)(ray + k * 4 + 0x60);
      local_7a0._0_16_ = ZEXT416(uVar82);
      local_7e0 = auVar11._0_8_;
      uStack_7d8 = auVar11._8_8_;
      local_870 = auVar153._0_8_;
      uStack_868 = auVar153._8_8_;
      local_880 = auVar89._0_8_;
      uStack_878 = auVar89._8_8_;
      local_7f0._0_4_ = auVar12._0_4_;
      fVar71 = (float)local_7f0;
      local_7f0._4_4_ = auVar12._4_4_;
      fVar72 = local_7f0._4_4_;
      uStack_7e8._0_4_ = auVar12._8_4_;
      fVar220 = (float)uStack_7e8;
      uStack_7e8._4_4_ = auVar12._12_4_;
      fVar225 = uStack_7e8._4_4_;
      local_7f0 = auVar12._0_8_;
      uStack_7e8 = auVar12._8_8_;
      fVar107 = fVar131;
      fVar201 = fVar105;
      fVar202 = fVar131;
      fVar203 = fVar105;
      fVar161 = fVar131;
      uStack_698 = local_6a0;
      uStack_690 = local_6a0;
      uStack_688 = local_6a0;
      local_520 = auVar95._0_4_;
      fStack_4dc = local_4e0;
      fStack_4d8 = local_4e0;
      fStack_4d4 = local_4e0;
      fStack_4d0 = local_4e0;
      fStack_4cc = local_4e0;
      fStack_4c8 = local_4e0;
      fStack_4c4 = local_4e0;
      if ((((((((auVar177 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar177 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar177 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar177 >> 0x7f,0) == '\0') &&
            (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar177 >> 0xbf,0) == '\0') &&
          (auVar177 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar177[0x1f]) {
        auVar130 = ZEXT3264(local_700);
        auVar200 = ZEXT3264(local_740);
      }
      else {
        _local_460 = vandps_avx(auVar195,auVar10);
        fVar212 = auVar13._0_4_;
        fVar218 = auVar13._4_4_;
        auVar21._4_4_ = fVar218 * fVar104;
        auVar21._0_4_ = fVar212 * fVar85;
        auVar21._8_4_ = fVar212 * fVar106;
        auVar21._12_4_ = fVar218 * fVar108;
        auVar21._16_4_ = fVar212 * fVar109;
        auVar21._20_4_ = fVar218 * fVar110;
        auVar21._24_4_ = fVar212 * fVar111;
        auVar21._28_4_ = local_460._28_4_;
        auVar12 = vfmadd213ps_fma(auVar100,local_420,auVar21);
        auVar12 = vfmadd213ps_fma(auVar121,auVar207,ZEXT1632(auVar12));
        auVar12 = vfmadd213ps_fma(auVar199,auVar191,ZEXT1632(auVar12));
        local_6e0._0_4_ = auVar75._0_4_;
        local_6e0._4_4_ = auVar75._4_4_;
        fStack_6d8 = auVar75._8_4_;
        fStack_6d4 = auVar75._12_4_;
        fStack_6d0 = auVar75._16_4_;
        fStack_6cc = auVar75._20_4_;
        fStack_6c8 = auVar75._24_4_;
        auVar96._0_4_ = fVar212 * (float)local_6e0._0_4_;
        auVar96._4_4_ = fVar218 * (float)local_6e0._4_4_;
        auVar96._8_4_ = fVar212 * fStack_6d8;
        auVar96._12_4_ = fVar218 * fStack_6d4;
        auVar96._16_4_ = fVar212 * fStack_6d0;
        auVar96._20_4_ = fVar218 * fStack_6cc;
        auVar96._24_4_ = fVar212 * fStack_6c8;
        auVar96._28_4_ = 0;
        auVar13 = vfmadd213ps_fma(auVar101,local_420,auVar96);
        auVar13 = vfmadd213ps_fma(auVar146,auVar207,ZEXT1632(auVar13));
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1210);
        auVar146 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1694);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar20 + 0x1b18);
        fVar85 = *(float *)(bezier_basis0 + lVar20 + 0x1f9c);
        fVar104 = *(float *)(bezier_basis0 + lVar20 + 0x1fa0);
        fVar106 = *(float *)(bezier_basis0 + lVar20 + 0x1fa4);
        fVar108 = *(float *)(bezier_basis0 + lVar20 + 0x1fa8);
        fVar109 = *(float *)(bezier_basis0 + lVar20 + 0x1fac);
        fVar110 = *(float *)(bezier_basis0 + lVar20 + 0x1fb0);
        fVar111 = *(float *)(bezier_basis0 + lVar20 + 0x1fb4);
        auVar22._4_4_ = local_4e0 * fVar104;
        auVar22._0_4_ = local_4e0 * fVar85;
        auVar22._8_4_ = local_4e0 * fVar106;
        auVar22._12_4_ = local_4e0 * fVar108;
        auVar22._16_4_ = local_4e0 * fVar109;
        auVar22._20_4_ = local_4e0 * fVar110;
        auVar22._24_4_ = local_4e0 * fVar111;
        auVar22._28_4_ = auVar94._28_4_;
        auVar23._4_4_ = fVar104 * fVar105;
        auVar23._0_4_ = fVar85 * fVar131;
        auVar23._8_4_ = fVar106 * fVar131;
        auVar23._12_4_ = fVar108 * fVar105;
        auVar23._16_4_ = fVar109 * fVar131;
        auVar23._20_4_ = fVar110 * fVar105;
        auVar23._24_4_ = fVar111 * fVar131;
        auVar23._28_4_ = *(undefined4 *)(bezier_basis1 + lVar20 + 0xda8);
        auVar24._4_4_ = fVar104 * fVar218;
        auVar24._0_4_ = fVar85 * fVar212;
        auVar24._8_4_ = fVar106 * fVar212;
        auVar24._12_4_ = fVar108 * fVar218;
        auVar24._16_4_ = fVar109 * fVar212;
        auVar24._20_4_ = fVar110 * fVar218;
        auVar24._24_4_ = fVar111 * fVar212;
        auVar24._28_4_ = auVar14._4_4_;
        auVar14 = vfmadd231ps_fma(auVar22,auVar100,local_740);
        auVar90 = vfmadd231ps_fma(auVar23,auVar100,local_700);
        auVar133 = vfmadd231ps_fma(auVar24,local_420,auVar100);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,auVar182);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar146,local_500);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar207,auVar146);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar101,auVar175);
        auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar101,local_620);
        auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar101,auVar191);
        fVar85 = *(float *)(bezier_basis1 + lVar20 + 0x1f9c);
        fVar104 = *(float *)(bezier_basis1 + lVar20 + 0x1fa0);
        fVar106 = *(float *)(bezier_basis1 + lVar20 + 0x1fa4);
        fVar108 = *(float *)(bezier_basis1 + lVar20 + 0x1fa8);
        fVar109 = *(float *)(bezier_basis1 + lVar20 + 0x1fac);
        fVar110 = *(float *)(bezier_basis1 + lVar20 + 0x1fb0);
        fVar111 = *(float *)(bezier_basis1 + lVar20 + 0x1fb4);
        auVar209._0_4_ = local_4e0 * fVar85;
        auVar209._4_4_ = local_4e0 * fVar104;
        auVar209._8_4_ = local_4e0 * fVar106;
        auVar209._12_4_ = local_4e0 * fVar108;
        auVar209._16_4_ = local_4e0 * fVar109;
        auVar209._20_4_ = local_4e0 * fVar110;
        auVar209._24_4_ = local_4e0 * fVar111;
        auVar209._28_4_ = 0;
        auVar100._4_4_ = fVar105 * fVar104;
        auVar100._0_4_ = fVar131 * fVar85;
        auVar100._8_4_ = fVar131 * fVar106;
        auVar100._12_4_ = fVar105 * fVar108;
        auVar100._16_4_ = fVar131 * fVar109;
        auVar100._20_4_ = fVar105 * fVar110;
        auVar100._24_4_ = fVar131 * fVar111;
        auVar100._28_4_ = local_4e0;
        auVar25._4_4_ = fVar218 * fVar104;
        auVar25._0_4_ = fVar212 * fVar85;
        auVar25._8_4_ = fVar212 * fVar106;
        auVar25._12_4_ = fVar218 * fVar108;
        auVar25._16_4_ = fVar212 * fVar109;
        auVar25._20_4_ = fVar218 * fVar110;
        auVar25._24_4_ = fVar212 * fVar111;
        auVar25._28_4_ = fVar218;
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1b18);
        auVar114 = vfmadd231ps_fma(auVar209,auVar101,local_740);
        auVar88 = vfmadd231ps_fma(auVar100,auVar101,local_700);
        auVar115 = vfmadd231ps_fma(auVar25,local_420,auVar101);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1694);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar101,auVar182);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar101,local_500);
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar101,auVar207);
        auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar20 + 0x1210);
        auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar101,auVar175);
        auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar101,local_620);
        auVar118._8_4_ = 0x7fffffff;
        auVar118._0_8_ = 0x7fffffff7fffffff;
        auVar118._12_4_ = 0x7fffffff;
        auVar118._16_4_ = 0x7fffffff;
        auVar118._20_4_ = 0x7fffffff;
        auVar118._24_4_ = 0x7fffffff;
        auVar118._28_4_ = 0x7fffffff;
        auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar191,auVar101);
        auVar101 = vandps_avx(ZEXT1632(auVar14),auVar118);
        auVar146 = vandps_avx(ZEXT1632(auVar90),auVar118);
        auVar146 = vmaxps_avx(auVar101,auVar146);
        auVar101 = vandps_avx(ZEXT1632(auVar133),auVar118);
        auVar101 = vmaxps_avx(auVar146,auVar101);
        auVar147._4_4_ = fVar132;
        auVar147._0_4_ = fVar132;
        auVar147._8_4_ = fVar132;
        auVar147._12_4_ = fVar132;
        auVar147._16_4_ = fVar132;
        auVar147._20_4_ = fVar132;
        auVar147._24_4_ = fVar132;
        auVar147._28_4_ = fVar132;
        auVar101 = vcmpps_avx(auVar101,auVar147,1);
        auVar100 = vblendvps_avx(ZEXT1632(auVar14),auVar149,auVar101);
        auVar121 = vblendvps_avx(ZEXT1632(auVar90),auVar17,auVar101);
        auVar101 = vandps_avx(ZEXT1632(auVar114),auVar118);
        auVar146 = vandps_avx(ZEXT1632(auVar88),auVar118);
        auVar146 = vmaxps_avx(auVar101,auVar146);
        auVar101 = vandps_avx(ZEXT1632(auVar115),auVar118);
        auVar101 = vmaxps_avx(auVar146,auVar101);
        auVar199 = vcmpps_avx(auVar101,auVar147,1);
        auVar101 = vblendvps_avx(ZEXT1632(auVar114),auVar149,auVar199);
        auVar146 = vblendvps_avx(ZEXT1632(auVar88),auVar17,auVar199);
        auVar13 = vfmadd213ps_fma(auVar157,auVar191,ZEXT1632(auVar13));
        auVar14 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,auVar121);
        auVar157 = vrsqrtps_avx(ZEXT1632(auVar14));
        fVar85 = auVar157._0_4_;
        fVar104 = auVar157._4_4_;
        fVar106 = auVar157._8_4_;
        fVar108 = auVar157._12_4_;
        fVar109 = auVar157._16_4_;
        fVar110 = auVar157._20_4_;
        fVar111 = auVar157._24_4_;
        auVar149._4_4_ = fVar104 * fVar104 * fVar104 * auVar14._4_4_ * -0.5;
        auVar149._0_4_ = fVar85 * fVar85 * fVar85 * auVar14._0_4_ * -0.5;
        auVar149._8_4_ = fVar106 * fVar106 * fVar106 * auVar14._8_4_ * -0.5;
        auVar149._12_4_ = fVar108 * fVar108 * fVar108 * auVar14._12_4_ * -0.5;
        auVar149._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar149._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar149._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar149._28_4_ = 0;
        auVar210._8_4_ = 0x3fc00000;
        auVar210._0_8_ = 0x3fc000003fc00000;
        auVar210._12_4_ = 0x3fc00000;
        auVar210._16_4_ = 0x3fc00000;
        auVar210._20_4_ = 0x3fc00000;
        auVar210._24_4_ = 0x3fc00000;
        auVar210._28_4_ = 0x3fc00000;
        auVar14 = vfmadd231ps_fma(auVar149,auVar210,auVar157);
        fVar85 = auVar14._0_4_;
        fVar104 = auVar14._4_4_;
        auVar17._4_4_ = auVar121._4_4_ * fVar104;
        auVar17._0_4_ = auVar121._0_4_ * fVar85;
        fVar106 = auVar14._8_4_;
        auVar17._8_4_ = auVar121._8_4_ * fVar106;
        fVar108 = auVar14._12_4_;
        auVar17._12_4_ = auVar121._12_4_ * fVar108;
        auVar17._16_4_ = auVar121._16_4_ * 0.0;
        auVar17._20_4_ = auVar121._20_4_ * 0.0;
        auVar17._24_4_ = auVar121._24_4_ * 0.0;
        auVar17._28_4_ = auVar157._28_4_;
        auVar26._4_4_ = -auVar100._4_4_ * fVar104;
        auVar26._0_4_ = -auVar100._0_4_ * fVar85;
        auVar26._8_4_ = -auVar100._8_4_ * fVar106;
        auVar26._12_4_ = -auVar100._12_4_ * fVar108;
        auVar26._16_4_ = -auVar100._16_4_ * 0.0;
        auVar26._20_4_ = -auVar100._20_4_ * 0.0;
        auVar26._24_4_ = -auVar100._24_4_ * 0.0;
        auVar26._28_4_ = 0x80000000;
        auVar14 = vfmadd213ps_fma(auVar101,auVar101,ZEXT832(0) << 0x20);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar146,auVar146);
        auVar157 = vrsqrtps_avx(ZEXT1632(auVar14));
        auVar27._28_4_ = auVar199._28_4_;
        auVar27._0_28_ =
             ZEXT1628(CONCAT412(fVar108 * 0.0,
                                CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar85 * 0.0))));
        fVar85 = auVar157._0_4_;
        fVar104 = auVar157._4_4_;
        fVar106 = auVar157._8_4_;
        fVar108 = auVar157._12_4_;
        fVar109 = auVar157._16_4_;
        fVar110 = auVar157._20_4_;
        fVar111 = auVar157._24_4_;
        auVar28._4_4_ = fVar104 * fVar104 * fVar104 * auVar14._4_4_ * -0.5;
        auVar28._0_4_ = fVar85 * fVar85 * fVar85 * auVar14._0_4_ * -0.5;
        auVar28._8_4_ = fVar106 * fVar106 * fVar106 * auVar14._8_4_ * -0.5;
        auVar28._12_4_ = fVar108 * fVar108 * fVar108 * auVar14._12_4_ * -0.5;
        auVar28._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
        auVar28._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
        auVar28._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
        auVar28._28_4_ = 0;
        auVar14 = vfmadd231ps_fma(auVar28,auVar210,auVar157);
        fVar85 = auVar14._0_4_;
        fVar104 = auVar14._4_4_;
        auVar29._4_4_ = auVar146._4_4_ * fVar104;
        auVar29._0_4_ = auVar146._0_4_ * fVar85;
        fVar106 = auVar14._8_4_;
        auVar29._8_4_ = auVar146._8_4_ * fVar106;
        fVar108 = auVar14._12_4_;
        auVar29._12_4_ = auVar146._12_4_ * fVar108;
        auVar29._16_4_ = auVar146._16_4_ * 0.0;
        auVar29._20_4_ = auVar146._20_4_ * 0.0;
        auVar29._24_4_ = auVar146._24_4_ * 0.0;
        auVar29._28_4_ = auVar146._28_4_;
        auVar30._4_4_ = fVar104 * -auVar101._4_4_;
        auVar30._0_4_ = fVar85 * -auVar101._0_4_;
        auVar30._8_4_ = fVar106 * -auVar101._8_4_;
        auVar30._12_4_ = fVar108 * -auVar101._12_4_;
        auVar30._16_4_ = -auVar101._16_4_ * 0.0;
        auVar30._20_4_ = -auVar101._20_4_ * 0.0;
        auVar30._24_4_ = -auVar101._24_4_ * 0.0;
        auVar30._28_4_ = auVar100._28_4_ ^ 0x80000000;
        auVar31._28_4_ = auVar157._28_4_;
        auVar31._0_28_ =
             ZEXT1628(CONCAT412(fVar108 * 0.0,
                                CONCAT48(fVar106 * 0.0,CONCAT44(fVar104 * 0.0,fVar85 * 0.0))));
        auVar14 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar15),local_440);
        local_5a0 = ZEXT1632(auVar14);
        auVar101 = ZEXT1632(auVar15);
        auVar14 = vfmadd213ps_fma(auVar26,auVar101,_local_580);
        local_5c0 = ZEXT1632(auVar14);
        auVar14 = vfmadd213ps_fma(auVar27,auVar101,ZEXT1632(auVar13));
        local_480 = ZEXT1632(auVar14);
        auVar133 = vfnmadd213ps_fma(auVar17,auVar101,local_440);
        auVar14 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar16),auVar93);
        auVar114 = vfnmadd213ps_fma(auVar26,auVar101,_local_580);
        auVar101 = ZEXT1632(auVar16);
        auVar90 = vfmadd213ps_fma(auVar30,auVar101,local_560);
        auVar117 = ZEXT1632(auVar15);
        auVar163 = vfnmadd231ps_fma(ZEXT1632(auVar13),auVar117,auVar27);
        auVar13 = vfmadd213ps_fma(auVar31,auVar101,ZEXT1632(auVar12));
        auVar88 = vfnmadd213ps_fma(auVar29,auVar101,auVar93);
        auVar115 = vfnmadd213ps_fma(auVar30,auVar101,local_560);
        auVar87 = vfnmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar16),auVar31);
        auVar101 = vsubps_avx(ZEXT1632(auVar90),ZEXT1632(auVar114));
        auVar146 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar163));
        auVar93._4_4_ = auVar163._4_4_ * auVar101._4_4_;
        auVar93._0_4_ = auVar163._0_4_ * auVar101._0_4_;
        auVar93._8_4_ = auVar163._8_4_ * auVar101._8_4_;
        auVar93._12_4_ = auVar163._12_4_ * auVar101._12_4_;
        auVar93._16_4_ = auVar101._16_4_ * 0.0;
        auVar93._20_4_ = auVar101._20_4_ * 0.0;
        auVar93._24_4_ = auVar101._24_4_ * 0.0;
        auVar93._28_4_ = 0;
        auVar15 = vfmsub231ps_fma(auVar93,ZEXT1632(auVar114),auVar146);
        auVar32._4_4_ = auVar133._4_4_ * auVar146._4_4_;
        auVar32._0_4_ = auVar133._0_4_ * auVar146._0_4_;
        auVar32._8_4_ = auVar133._8_4_ * auVar146._8_4_;
        auVar32._12_4_ = auVar133._12_4_ * auVar146._12_4_;
        auVar32._16_4_ = auVar146._16_4_ * 0.0;
        auVar32._20_4_ = auVar146._20_4_ * 0.0;
        auVar32._24_4_ = auVar146._24_4_ * 0.0;
        auVar32._28_4_ = auVar146._28_4_;
        auVar195 = ZEXT1632(auVar133);
        auVar146 = vsubps_avx(ZEXT1632(auVar14),auVar195);
        auVar12 = vfmsub231ps_fma(auVar32,ZEXT1632(auVar163),auVar146);
        auVar33._4_4_ = auVar114._4_4_ * auVar146._4_4_;
        auVar33._0_4_ = auVar114._0_4_ * auVar146._0_4_;
        auVar33._8_4_ = auVar114._8_4_ * auVar146._8_4_;
        auVar33._12_4_ = auVar114._12_4_ * auVar146._12_4_;
        auVar33._16_4_ = auVar146._16_4_ * 0.0;
        auVar33._20_4_ = auVar146._20_4_ * 0.0;
        auVar33._24_4_ = auVar146._24_4_ * 0.0;
        auVar33._28_4_ = auVar146._28_4_;
        auVar133 = vfmsub231ps_fma(auVar33,auVar195,auVar101);
        auVar101 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar101,ZEXT1632(auVar12));
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,ZEXT1632(auVar15));
        auVar17 = vcmpps_avx(ZEXT1632(auVar12),ZEXT1232(ZEXT812(0)) << 0x20,2);
        auVar101 = vblendvps_avx(ZEXT1632(auVar88),local_5a0,auVar17);
        auVar146 = vblendvps_avx(ZEXT1632(auVar115),local_5c0,auVar17);
        auVar157 = vblendvps_avx(ZEXT1632(auVar87),local_480,auVar17);
        auVar100 = vblendvps_avx(auVar195,ZEXT1632(auVar14),auVar17);
        auVar121 = vblendvps_avx(ZEXT1632(auVar114),ZEXT1632(auVar90),auVar17);
        auVar199 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar13),auVar17);
        auVar195 = vblendvps_avx(ZEXT1632(auVar14),auVar195,auVar17);
        auVar10 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar114),auVar17);
        auVar12 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
        auVar181 = ZEXT1664(auVar12);
        auVar149 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar163),auVar17);
        auVar94 = vsubps_avx(auVar195,auVar101);
        auVar10 = vsubps_avx(auVar10,auVar146);
        auVar177 = vsubps_avx(auVar149,auVar157);
        auVar18 = vsubps_avx(auVar101,auVar100);
        auVar19 = vsubps_avx(auVar146,auVar121);
        auVar93 = vsubps_avx(auVar157,auVar199);
        auVar34._4_4_ = auVar177._4_4_ * auVar101._4_4_;
        auVar34._0_4_ = auVar177._0_4_ * auVar101._0_4_;
        auVar34._8_4_ = auVar177._8_4_ * auVar101._8_4_;
        auVar34._12_4_ = auVar177._12_4_ * auVar101._12_4_;
        auVar34._16_4_ = auVar177._16_4_ * auVar101._16_4_;
        auVar34._20_4_ = auVar177._20_4_ * auVar101._20_4_;
        auVar34._24_4_ = auVar177._24_4_ * auVar101._24_4_;
        auVar34._28_4_ = auVar149._28_4_;
        auVar13 = vfmsub231ps_fma(auVar34,auVar157,auVar94);
        auVar35._4_4_ = auVar94._4_4_ * auVar146._4_4_;
        auVar35._0_4_ = auVar94._0_4_ * auVar146._0_4_;
        auVar35._8_4_ = auVar94._8_4_ * auVar146._8_4_;
        auVar35._12_4_ = auVar94._12_4_ * auVar146._12_4_;
        auVar35._16_4_ = auVar94._16_4_ * auVar146._16_4_;
        auVar35._20_4_ = auVar94._20_4_ * auVar146._20_4_;
        auVar35._24_4_ = auVar94._24_4_ * auVar146._24_4_;
        auVar35._28_4_ = auVar195._28_4_;
        auVar14 = vfmsub231ps_fma(auVar35,auVar101,auVar10);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
        auVar97._0_4_ = auVar10._0_4_ * auVar157._0_4_;
        auVar97._4_4_ = auVar10._4_4_ * auVar157._4_4_;
        auVar97._8_4_ = auVar10._8_4_ * auVar157._8_4_;
        auVar97._12_4_ = auVar10._12_4_ * auVar157._12_4_;
        auVar97._16_4_ = auVar10._16_4_ * auVar157._16_4_;
        auVar97._20_4_ = auVar10._20_4_ * auVar157._20_4_;
        auVar97._24_4_ = auVar10._24_4_ * auVar157._24_4_;
        auVar97._28_4_ = 0;
        auVar14 = vfmsub231ps_fma(auVar97,auVar146,auVar177);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
        auVar98._0_4_ = auVar93._0_4_ * auVar100._0_4_;
        auVar98._4_4_ = auVar93._4_4_ * auVar100._4_4_;
        auVar98._8_4_ = auVar93._8_4_ * auVar100._8_4_;
        auVar98._12_4_ = auVar93._12_4_ * auVar100._12_4_;
        auVar98._16_4_ = auVar93._16_4_ * auVar100._16_4_;
        auVar98._20_4_ = auVar93._20_4_ * auVar100._20_4_;
        auVar98._24_4_ = auVar93._24_4_ * auVar100._24_4_;
        auVar98._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar98,auVar18,auVar199);
        auVar36._4_4_ = auVar19._4_4_ * auVar199._4_4_;
        auVar36._0_4_ = auVar19._0_4_ * auVar199._0_4_;
        auVar36._8_4_ = auVar19._8_4_ * auVar199._8_4_;
        auVar36._12_4_ = auVar19._12_4_ * auVar199._12_4_;
        auVar36._16_4_ = auVar19._16_4_ * auVar199._16_4_;
        auVar36._20_4_ = auVar19._20_4_ * auVar199._20_4_;
        auVar36._24_4_ = auVar19._24_4_ * auVar199._24_4_;
        auVar36._28_4_ = auVar199._28_4_;
        auVar15 = vfmsub231ps_fma(auVar36,auVar121,auVar93);
        auVar37._4_4_ = auVar18._4_4_ * auVar121._4_4_;
        auVar37._0_4_ = auVar18._0_4_ * auVar121._0_4_;
        auVar37._8_4_ = auVar18._8_4_ * auVar121._8_4_;
        auVar37._12_4_ = auVar18._12_4_ * auVar121._12_4_;
        auVar37._16_4_ = auVar18._16_4_ * auVar121._16_4_;
        auVar37._20_4_ = auVar18._20_4_ * auVar121._20_4_;
        auVar37._24_4_ = auVar18._24_4_ * auVar121._24_4_;
        auVar37._28_4_ = auVar121._28_4_;
        auVar90 = vfmsub231ps_fma(auVar37,auVar19,auVar100);
        auVar121 = ZEXT832(0) << 0x20;
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar121,ZEXT1632(auVar13));
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar121,ZEXT1632(auVar15));
        auVar100 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
        auVar100 = vcmpps_avx(auVar100,ZEXT832(0) << 0x20,2);
        auVar13 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
        auVar12 = vpand_avx(auVar13,auVar12);
        auVar100 = vpmovsxwd_avx2(auVar12);
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar100 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar100 >> 0x7f,0) == '\0') &&
              (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar100 >> 0xbf,0) == '\0') &&
            (auVar100 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar100[0x1f]) {
LAB_015f3ba9:
          auVar167._8_8_ = local_660[1]._8_8_;
          auVar167._0_8_ = local_660[1]._0_8_;
          auVar167._16_8_ = local_660[1]._16_8_;
          auVar167._24_8_ = local_660[1]._24_8_;
        }
        else {
          auVar38._4_4_ = auVar10._4_4_ * auVar93._4_4_;
          auVar38._0_4_ = auVar10._0_4_ * auVar93._0_4_;
          auVar38._8_4_ = auVar10._8_4_ * auVar93._8_4_;
          auVar38._12_4_ = auVar10._12_4_ * auVar93._12_4_;
          auVar38._16_4_ = auVar10._16_4_ * auVar93._16_4_;
          auVar38._20_4_ = auVar10._20_4_ * auVar93._20_4_;
          auVar38._24_4_ = auVar10._24_4_ * auVar93._24_4_;
          auVar38._28_4_ = auVar100._28_4_;
          auVar114 = vfmsub231ps_fma(auVar38,auVar19,auVar177);
          auVar119._0_4_ = auVar18._0_4_ * auVar177._0_4_;
          auVar119._4_4_ = auVar18._4_4_ * auVar177._4_4_;
          auVar119._8_4_ = auVar18._8_4_ * auVar177._8_4_;
          auVar119._12_4_ = auVar18._12_4_ * auVar177._12_4_;
          auVar119._16_4_ = auVar18._16_4_ * auVar177._16_4_;
          auVar119._20_4_ = auVar18._20_4_ * auVar177._20_4_;
          auVar119._24_4_ = auVar18._24_4_ * auVar177._24_4_;
          auVar119._28_4_ = 0;
          auVar133 = vfmsub231ps_fma(auVar119,auVar94,auVar93);
          auVar39._4_4_ = auVar94._4_4_ * auVar19._4_4_;
          auVar39._0_4_ = auVar94._0_4_ * auVar19._0_4_;
          auVar39._8_4_ = auVar94._8_4_ * auVar19._8_4_;
          auVar39._12_4_ = auVar94._12_4_ * auVar19._12_4_;
          auVar39._16_4_ = auVar94._16_4_ * auVar19._16_4_;
          auVar39._20_4_ = auVar94._20_4_ * auVar19._20_4_;
          auVar39._24_4_ = auVar94._24_4_ * auVar19._24_4_;
          auVar39._28_4_ = auVar94._28_4_;
          auVar88 = vfmsub231ps_fma(auVar39,auVar18,auVar10);
          auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar133),ZEXT1632(auVar88));
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar114),auVar121);
          auVar100 = vrcpps_avx(ZEXT1632(auVar90));
          auVar211._8_4_ = 0x3f800000;
          auVar211._0_8_ = 0x3f8000003f800000;
          auVar211._12_4_ = 0x3f800000;
          auVar211._16_4_ = 0x3f800000;
          auVar211._20_4_ = 0x3f800000;
          auVar211._24_4_ = 0x3f800000;
          auVar211._28_4_ = 0x3f800000;
          auVar13 = vfnmadd213ps_fma(auVar100,ZEXT1632(auVar90),auVar211);
          auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar100,auVar100);
          auVar176._0_4_ = auVar157._0_4_ * auVar88._0_4_;
          auVar176._4_4_ = auVar157._4_4_ * auVar88._4_4_;
          auVar176._8_4_ = auVar157._8_4_ * auVar88._8_4_;
          auVar176._12_4_ = auVar157._12_4_ * auVar88._12_4_;
          auVar176._16_4_ = auVar157._16_4_ * 0.0;
          auVar176._20_4_ = auVar157._20_4_ * 0.0;
          auVar176._24_4_ = auVar157._24_4_ * 0.0;
          auVar176._28_4_ = 0;
          auVar133 = vfmadd231ps_fma(auVar176,auVar146,ZEXT1632(auVar133));
          auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar114),auVar101);
          fVar85 = auVar13._0_4_;
          fVar104 = auVar13._4_4_;
          fVar106 = auVar13._8_4_;
          fVar108 = auVar13._12_4_;
          auVar157 = ZEXT1632(CONCAT412(fVar108 * auVar133._12_4_,
                                        CONCAT48(fVar106 * auVar133._8_4_,
                                                 CONCAT44(fVar104 * auVar133._4_4_,
                                                          fVar85 * auVar133._0_4_))));
          auVar181 = ZEXT3264(auVar157);
          auVar99._4_4_ = uVar82;
          auVar99._0_4_ = uVar82;
          auVar99._8_4_ = uVar82;
          auVar99._12_4_ = uVar82;
          auVar99._16_4_ = uVar82;
          auVar99._20_4_ = uVar82;
          auVar99._24_4_ = uVar82;
          auVar99._28_4_ = uVar82;
          uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar120._4_4_ = uVar112;
          auVar120._0_4_ = uVar112;
          auVar120._8_4_ = uVar112;
          auVar120._12_4_ = uVar112;
          auVar120._16_4_ = uVar112;
          auVar120._20_4_ = uVar112;
          auVar120._24_4_ = uVar112;
          auVar120._28_4_ = uVar112;
          auVar101 = vcmpps_avx(auVar99,auVar157,2);
          auVar146 = vcmpps_avx(auVar157,auVar120,2);
          auVar101 = vandps_avx(auVar146,auVar101);
          auVar13 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
          auVar12 = vpand_avx(auVar12,auVar13);
          auVar101 = vpmovsxwd_avx2(auVar12);
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar101 >> 0x7f,0) == '\0') &&
                (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar101 >> 0xbf,0) == '\0') &&
              (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar101[0x1f]) goto LAB_015f3ba9;
          auVar101 = vcmpps_avx(auVar121,ZEXT1632(auVar90),4);
          auVar13 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
          auVar12 = vpand_avx(auVar12,auVar13);
          auVar101 = vpmovsxwd_avx2(auVar12);
          auVar167._8_8_ = local_660[1]._8_8_;
          auVar167._0_8_ = local_660[1]._0_8_;
          auVar167._16_8_ = local_660[1]._16_8_;
          auVar167._24_8_ = local_660[1]._24_8_;
          if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar101 >> 0x7f,0) != '\0') ||
                (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar101 >> 0xbf,0) != '\0') ||
              (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar101[0x1f] < '\0') {
            auVar100 = ZEXT1632(CONCAT412(fVar108 * auVar14._12_4_,
                                          CONCAT48(fVar106 * auVar14._8_4_,
                                                   CONCAT44(fVar104 * auVar14._4_4_,
                                                            fVar85 * auVar14._0_4_))));
            auVar121 = ZEXT1632(CONCAT412(fVar108 * auVar15._12_4_,
                                          CONCAT48(fVar106 * auVar15._8_4_,
                                                   CONCAT44(fVar104 * auVar15._4_4_,
                                                            fVar85 * auVar15._0_4_))));
            auVar166._8_4_ = 0x3f800000;
            auVar166._0_8_ = 0x3f8000003f800000;
            auVar166._12_4_ = 0x3f800000;
            auVar166._16_4_ = 0x3f800000;
            auVar166._20_4_ = 0x3f800000;
            auVar166._24_4_ = 0x3f800000;
            auVar166._28_4_ = 0x3f800000;
            auVar146 = vsubps_avx(auVar166,auVar100);
            _local_280 = vblendvps_avx(auVar146,auVar100,auVar17);
            auVar146 = vsubps_avx(auVar166,auVar121);
            local_4a0 = vblendvps_avx(auVar146,auVar121,auVar17);
            auVar167 = auVar101;
            local_5e0 = auVar157;
          }
        }
        auVar217 = ZEXT3264(auVar214);
        auVar130 = ZEXT3264(auVar207);
        auVar200 = ZEXT3264(local_740);
        if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar167 >> 0x7f,0) != '\0') ||
              (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar167 >> 0xbf,0) != '\0') ||
            (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar167[0x1f] < '\0') {
          auVar101 = vsubps_avx(ZEXT1632(auVar16),auVar117);
          auVar12 = vfmadd213ps_fma(auVar101,_local_280,auVar117);
          fVar85 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar40._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar85;
          auVar40._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar85;
          auVar40._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar85;
          auVar40._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar85;
          auVar40._16_4_ = fVar85 * 0.0;
          auVar40._20_4_ = fVar85 * 0.0;
          auVar40._24_4_ = fVar85 * 0.0;
          auVar40._28_4_ = 0;
          auVar101 = vcmpps_avx(local_5e0,auVar40,6);
          auVar146 = auVar167 & auVar101;
          auVar193 = ZEXT3264(auVar191);
          if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar146 >> 0x7f,0) == '\0') &&
                (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar146 >> 0xbf,0) == '\0') &&
              (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar146[0x1f]) {
            auVar130 = ZEXT3264(local_700);
            goto LAB_015f2911;
          }
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar148._8_4_ = 0x40000000;
          auVar148._0_8_ = 0x4000000040000000;
          auVar148._12_4_ = 0x40000000;
          auVar148._16_4_ = 0x40000000;
          auVar148._20_4_ = 0x40000000;
          auVar148._24_4_ = 0x40000000;
          auVar148._28_4_ = 0x40000000;
          auVar12 = vfmadd213ps_fma(local_4a0,auVar148,auVar122);
          auVar181 = ZEXT1664(auVar12);
          local_3e0 = _local_280;
          local_3c0 = ZEXT1632(auVar12);
          local_3a0 = local_5e0;
          local_380 = 0;
          local_370 = local_7e0;
          uStack_368 = uStack_7d8;
          local_360 = local_870;
          uStack_358 = uStack_868;
          local_350 = local_880;
          uStack_348 = uStack_878;
          local_340 = local_7f0;
          uStack_338 = uStack_7e8;
          local_4a0 = local_3c0;
          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
            local_680 = vandps_avx(auVar101,auVar167);
            fVar131 = 1.0 / auVar95._0_4_;
            local_300[0] = fVar131 * ((float)local_280._0_4_ + 0.0);
            local_300[1] = fVar131 * ((float)local_280._4_4_ + 1.0);
            local_300[2] = fVar131 * (fStack_278 + 2.0);
            local_300[3] = fVar131 * (fStack_274 + 3.0);
            fStack_2f0 = fVar131 * (fStack_270 + 4.0);
            fStack_2ec = fVar131 * (fStack_26c + 5.0);
            fStack_2e8 = fVar131 * (fStack_268 + 6.0);
            fStack_2e4 = fStack_264 + 7.0;
            local_4a0._0_8_ = auVar12._0_8_;
            local_4a0._8_8_ = auVar12._8_8_;
            local_2e0 = local_4a0._0_8_;
            uStack_2d8 = local_4a0._8_8_;
            uStack_2d0 = 0;
            uStack_2c8 = 0;
            local_2c0 = local_5e0;
            auVar123._8_4_ = 0x7f800000;
            auVar123._0_8_ = 0x7f8000007f800000;
            auVar123._12_4_ = 0x7f800000;
            auVar123._16_4_ = 0x7f800000;
            auVar123._20_4_ = 0x7f800000;
            auVar123._24_4_ = 0x7f800000;
            auVar123._28_4_ = 0x7f800000;
            auVar101 = vblendvps_avx(auVar123,local_5e0,local_680);
            auVar146 = vshufps_avx(auVar101,auVar101,0xb1);
            auVar146 = vminps_avx(auVar101,auVar146);
            auVar157 = vshufpd_avx(auVar146,auVar146,5);
            auVar146 = vminps_avx(auVar146,auVar157);
            auVar157 = vpermpd_avx2(auVar146,0x4e);
            auVar146 = vminps_avx(auVar146,auVar157);
            auVar146 = vcmpps_avx(auVar101,auVar146,0);
            auVar157 = local_680 & auVar146;
            auVar101 = local_680;
            if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar157 >> 0x7f,0) != '\0') ||
                  (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar157 >> 0xbf,0) != '\0') ||
                (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar157[0x1f] < '\0') {
              auVar101 = vandps_avx(auVar146,local_680);
            }
            uVar79 = vmovmskps_avx(auVar101);
            uVar82 = 0;
            for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
              uVar82 = uVar82 + 1;
            }
            uVar80 = (ulong)uVar82;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar131 = local_300[uVar80];
              uVar112 = *(undefined4 *)((long)&local_2e0 + uVar80 * 4);
              fVar107 = 1.0 - fVar131;
              fVar105 = fVar107 * fVar107 * -3.0;
              auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 * fVar107)),
                                        ZEXT416((uint)(fVar131 * fVar107)),ZEXT416(0xc0000000));
              auVar13 = vfmsub132ss_fma(ZEXT416((uint)(fVar131 * fVar107)),
                                        ZEXT416((uint)(fVar131 * fVar131)),ZEXT416(0x40000000));
              fVar107 = auVar12._0_4_ * 3.0;
              fVar201 = auVar13._0_4_ * 3.0;
              fVar202 = fVar131 * fVar131 * 3.0;
              auVar171._0_4_ = fVar202 * fVar71;
              auVar171._4_4_ = fVar202 * fVar72;
              auVar171._8_4_ = fVar202 * fVar220;
              auVar171._12_4_ = fVar202 * fVar225;
              auVar181 = ZEXT1664(auVar171);
              auVar136._4_4_ = fVar201;
              auVar136._0_4_ = fVar201;
              auVar136._8_4_ = fVar201;
              auVar136._12_4_ = fVar201;
              auVar12 = vfmadd132ps_fma(auVar136,auVar171,auVar89);
              auVar155._4_4_ = fVar107;
              auVar155._0_4_ = fVar107;
              auVar155._8_4_ = fVar107;
              auVar155._12_4_ = fVar107;
              auVar12 = vfmadd132ps_fma(auVar155,auVar12,auVar153);
              auVar137._4_4_ = fVar105;
              auVar137._0_4_ = fVar105;
              auVar137._8_4_ = fVar105;
              auVar137._12_4_ = fVar105;
              auVar12 = vfmadd132ps_fma(auVar137,auVar12,auVar11);
              *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar80 * 4);
              *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
              uVar187 = vextractps_avx(auVar12,1);
              *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar187;
              uVar187 = vextractps_avx(auVar12,2);
              *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar187;
              *(float *)(ray + k * 4 + 0x1e0) = fVar131;
              *(undefined4 *)(ray + k * 4 + 0x200) = uVar112;
              *(uint *)(ray + k * 4 + 0x220) = uVar7;
              *(uint *)(ray + k * 4 + 0x240) = uVar6;
              *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            }
            else {
              local_6c0._4_4_ = uVar6;
              local_6c0._0_4_ = uVar6;
              local_6c0._8_4_ = uVar6;
              local_6c0._12_4_ = uVar6;
              local_6c0._16_4_ = uVar6;
              local_6c0._20_4_ = uVar6;
              local_6c0._24_4_ = uVar6;
              local_6c0._28_4_ = uVar6;
              local_540._4_4_ = uVar7;
              local_540._0_4_ = uVar7;
              local_540._8_4_ = uVar7;
              local_540._12_4_ = uVar7;
              local_540._16_4_ = uVar7;
              local_540._20_4_ = uVar7;
              local_540._24_4_ = uVar7;
              local_540._28_4_ = uVar7;
              uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
              local_780 = auVar191;
              local_760 = auVar207;
              local_710 = ray;
              _local_6e0 = auVar214;
              local_37c = iVar78;
              while( true ) {
                local_1c0 = local_300[uVar80];
                local_1a0 = *(undefined4 *)((long)&local_2e0 + uVar80 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar80 * 4);
                fVar107 = 1.0 - local_1c0;
                auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar107 * fVar107)),
                                          ZEXT416((uint)(local_1c0 * fVar107)),ZEXT416(0xc0000000));
                auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar107)),
                                          ZEXT416((uint)(local_1c0 * local_1c0)),ZEXT416(0x40000000)
                                         );
                fVar131 = auVar12._0_4_ * 3.0;
                fVar105 = local_1c0 * local_1c0 * 3.0;
                auVar174._0_4_ = fVar105 * fVar71;
                auVar174._4_4_ = fVar105 * fVar72;
                auVar174._8_4_ = fVar105 * fVar220;
                auVar174._12_4_ = fVar105 * fVar225;
                auVar181 = ZEXT1664(auVar174);
                auVar143._4_4_ = fVar131;
                auVar143._0_4_ = fVar131;
                auVar143._8_4_ = fVar131;
                auVar143._12_4_ = fVar131;
                auVar12 = vfmadd132ps_fma(auVar143,auVar174,auVar89);
                fVar131 = auVar13._0_4_ * 3.0;
                auVar165._4_4_ = fVar131;
                auVar165._0_4_ = fVar131;
                auVar165._8_4_ = fVar131;
                auVar165._12_4_ = fVar131;
                auVar12 = vfmadd132ps_fma(auVar165,auVar12,auVar153);
                fVar131 = fVar107 * fVar107 * -3.0;
                local_7d0.context = context->user;
                auVar144._4_4_ = fVar131;
                auVar144._0_4_ = fVar131;
                auVar144._8_4_ = fVar131;
                auVar144._12_4_ = fVar131;
                auVar13 = vfmadd132ps_fma(auVar144,auVar12,auVar11);
                local_220 = auVar13._0_4_;
                uStack_21c = local_220;
                uStack_218 = local_220;
                uStack_214 = local_220;
                uStack_210 = local_220;
                uStack_20c = local_220;
                uStack_208 = local_220;
                uStack_204 = local_220;
                auVar12 = vmovshdup_avx(auVar13);
                local_200 = auVar12._0_8_;
                uStack_1f8 = local_200;
                uStack_1f0 = local_200;
                uStack_1e8 = local_200;
                auVar12 = vshufps_avx(auVar13,auVar13,0xaa);
                auVar145._0_8_ = auVar12._0_8_;
                auVar145._8_8_ = auVar145._0_8_;
                auVar152._16_8_ = auVar145._0_8_;
                auVar152._0_16_ = auVar145;
                auVar152._24_8_ = auVar145._0_8_;
                local_1e0 = auVar152;
                fStack_1bc = local_1c0;
                fStack_1b8 = local_1c0;
                fStack_1b4 = local_1c0;
                fStack_1b0 = local_1c0;
                fStack_1ac = local_1c0;
                fStack_1a8 = local_1c0;
                fStack_1a4 = local_1c0;
                uStack_19c = local_1a0;
                uStack_198 = local_1a0;
                uStack_194 = local_1a0;
                uStack_190 = local_1a0;
                uStack_18c = local_1a0;
                uStack_188 = local_1a0;
                uStack_184 = local_1a0;
                local_180 = local_540._0_8_;
                uStack_178 = local_540._8_8_;
                uStack_170 = local_540._16_8_;
                uStack_168 = local_540._24_8_;
                local_160 = local_6c0;
                auVar101 = vpcmpeqd_avx2(local_6c0,local_6c0);
                local_708[1] = auVar101;
                *local_708 = auVar101;
                local_140 = (local_7d0.context)->instID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_120 = (local_7d0.context)->instPrimID[0];
                uStack_11c = local_120;
                uStack_118 = local_120;
                uStack_114 = local_120;
                uStack_110 = local_120;
                uStack_10c = local_120;
                uStack_108 = local_120;
                uStack_104 = local_120;
                local_660[0] = local_2a0;
                local_7d0.valid = (int *)local_660;
                local_7d0.geometryUserPtr = pGVar8->userPtr;
                local_7d0.hit = (RTCHitN *)&local_220;
                local_7d0.N = 8;
                local_7d0.ray = (RTCRayN *)ray;
                if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar152 = ZEXT1632(auVar145);
                  auVar181 = ZEXT1664(auVar174);
                  (*pGVar8->intersectionFilterN)(&local_7d0);
                  auVar217 = ZEXT3264(_local_6e0);
                  auVar130 = ZEXT3264(local_760);
                  auVar193 = ZEXT3264(local_780);
                  auVar200 = ZEXT3264(local_740);
                  ray = local_710;
                }
                auVar146 = vpcmpeqd_avx2(local_660[0],_DAT_01faff00);
                auVar157 = vpcmpeqd_avx2(auVar152,auVar152);
                auVar101 = auVar157 & ~auVar146;
                if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar101 >> 0x7f,0) == '\0') &&
                      (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar101 >> 0xbf,0) == '\0') &&
                    (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar101[0x1f]) {
                  auVar146 = auVar146 ^ auVar157;
                }
                else {
                  p_Var9 = context->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar157 = ZEXT1632(auVar157._0_16_);
                    auVar181 = ZEXT1664(auVar181._0_16_);
                    (*p_Var9)(&local_7d0);
                    auVar217 = ZEXT3264(_local_6e0);
                    auVar130 = ZEXT3264(local_760);
                    auVar193 = ZEXT3264(local_780);
                    auVar200 = ZEXT3264(local_740);
                    ray = local_710;
                  }
                  auVar100 = vpcmpeqd_avx2(local_660[0],SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  auVar157 = vpcmpeqd_avx2(auVar157,auVar157);
                  auVar146 = auVar100 ^ auVar157;
                  auVar101 = auVar157 & ~auVar100;
                  if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar101 >> 0x7f,0) != '\0') ||
                        (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar101 >> 0xbf,0) != '\0') ||
                      (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar101[0x1f] < '\0') {
                    auVar128._0_4_ = auVar100._0_4_ ^ auVar157._0_4_;
                    auVar128._4_4_ = auVar100._4_4_ ^ auVar157._4_4_;
                    auVar128._8_4_ = auVar100._8_4_ ^ auVar157._8_4_;
                    auVar128._12_4_ = auVar100._12_4_ ^ auVar157._12_4_;
                    auVar128._16_4_ = auVar100._16_4_ ^ auVar157._16_4_;
                    auVar128._20_4_ = auVar100._20_4_ ^ auVar157._20_4_;
                    auVar128._24_4_ = auVar100._24_4_ ^ auVar157._24_4_;
                    auVar128._28_4_ = auVar100._28_4_ ^ auVar157._28_4_;
                    auVar101 = vmaskmovps_avx(auVar128,*(undefined1 (*) [32])local_7d0.hit);
                    *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0x20))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0x40))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0x60))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0x80))
                    ;
                    *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0xa0)
                                              );
                    *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0xc0)
                                              );
                    *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar128,*(undefined1 (*) [32])(local_7d0.hit + 0xe0)
                                              );
                    *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar101;
                    auVar101 = vpmaskmovd_avx2(auVar128,*(undefined1 (*) [32])
                                                         (local_7d0.hit + 0x100));
                    *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar101;
                  }
                }
                auVar101 = local_5e0;
                auVar191 = auVar193._0_32_;
                auVar207 = auVar130._0_32_;
                if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar146 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar146 >> 0x7f,0) == '\0') &&
                      (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar146 >> 0xbf,0) == '\0') &&
                    (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar146[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar112;
                }
                else {
                  uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
                }
                *(undefined4 *)(local_680 + uVar80 * 4) = 0;
                auVar103._4_4_ = uVar112;
                auVar103._0_4_ = uVar112;
                auVar103._8_4_ = uVar112;
                auVar103._12_4_ = uVar112;
                auVar103._16_4_ = uVar112;
                auVar103._20_4_ = uVar112;
                auVar103._24_4_ = uVar112;
                auVar103._28_4_ = uVar112;
                auVar157 = vcmpps_avx(auVar101,auVar103,2);
                auVar146 = vandps_avx(auVar157,local_680);
                local_680 = local_680 & auVar157;
                if ((((((((local_680 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_680 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_680 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_680 >> 0x7f,0) == '\0') &&
                      (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_680 >> 0xbf,0) == '\0') &&
                    (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_680[0x1f]) break;
                auVar129._8_4_ = 0x7f800000;
                auVar129._0_8_ = 0x7f8000007f800000;
                auVar129._12_4_ = 0x7f800000;
                auVar129._16_4_ = 0x7f800000;
                auVar129._20_4_ = 0x7f800000;
                auVar129._24_4_ = 0x7f800000;
                auVar129._28_4_ = 0x7f800000;
                auVar101 = vblendvps_avx(auVar129,auVar101,auVar146);
                auVar157 = vshufps_avx(auVar101,auVar101,0xb1);
                auVar157 = vminps_avx(auVar101,auVar157);
                auVar100 = vshufpd_avx(auVar157,auVar157,5);
                auVar157 = vminps_avx(auVar157,auVar100);
                auVar100 = vpermpd_avx2(auVar157,0x4e);
                auVar157 = vminps_avx(auVar157,auVar100);
                auVar157 = vcmpps_avx(auVar101,auVar157,0);
                auVar100 = auVar146 & auVar157;
                auVar101 = auVar146;
                if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar100 >> 0x7f,0) != '\0') ||
                      (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0xbf,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar100[0x1f] < '\0') {
                  auVar101 = vandps_avx(auVar157,auVar146);
                }
                uVar79 = vmovmskps_avx(auVar101);
                uVar82 = 0;
                for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                  uVar82 = uVar82 + 1;
                }
                uVar80 = (ulong)uVar82;
                local_680 = auVar146;
              }
            }
          }
          fVar131 = (float)local_6a0;
          fVar105 = local_6a0._4_4_;
          fVar107 = (float)uStack_698;
          fVar201 = uStack_698._4_4_;
          fVar202 = (float)uStack_690;
          fVar203 = uStack_690._4_4_;
          fVar161 = (float)uStack_688;
        }
        auVar130 = ZEXT3264(local_700);
      }
LAB_015f2911:
      if (8 < iVar78) {
        _local_6e0 = auVar217._0_32_;
        local_5a0._4_4_ = iVar78;
        local_5a0._0_4_ = iVar78;
        local_5a0._8_4_ = iVar78;
        local_5a0._12_4_ = iVar78;
        local_5a0._16_4_ = iVar78;
        local_5a0._20_4_ = iVar78;
        local_5a0._24_4_ = iVar78;
        local_5a0._28_4_ = iVar78;
        local_460._4_4_ = fVar132;
        local_460._0_4_ = fVar132;
        fStack_458 = fVar132;
        fStack_454 = fVar132;
        fStack_450 = fVar132;
        fStack_44c = fVar132;
        fStack_448 = fVar132;
        fStack_444 = fVar132;
        local_480._4_4_ = local_7a0._0_4_;
        local_480._0_4_ = local_7a0._0_4_;
        local_480._8_4_ = local_7a0._0_4_;
        local_480._12_4_ = local_7a0._0_4_;
        local_480._16_4_ = local_7a0._0_4_;
        local_480._20_4_ = local_7a0._0_4_;
        local_480._24_4_ = local_7a0._0_4_;
        local_480._28_4_ = local_7a0._0_4_;
        local_100 = 1.0 / local_520;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_e0 = uVar7;
        uStack_dc = uVar7;
        uStack_d8 = uVar7;
        uStack_d4 = uVar7;
        uStack_d0 = uVar7;
        uStack_cc = uVar7;
        uStack_c8 = uVar7;
        uStack_c4 = uVar7;
        lVar81 = 8;
        local_780 = auVar191;
        local_760 = auVar207;
        local_520 = (float)uVar6;
        uStack_51c = uVar6;
        uStack_518 = uVar6;
        uStack_514 = uVar6;
        uStack_510 = uVar6;
        uStack_50c = uVar6;
        uStack_508 = uVar6;
        uStack_504 = uVar6;
        do {
          auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar81 * 4 + lVar20);
          auVar146 = *(undefined1 (*) [32])(lVar20 + 0x21aa768 + lVar81 * 4);
          local_7a0 = *(undefined1 (*) [32])(lVar20 + 0x21aabec + lVar81 * 4);
          pauVar1 = (undefined1 (*) [28])(lVar20 + 0x21ab070 + lVar81 * 4);
          fVar85 = *(float *)*pauVar1;
          fVar104 = *(float *)(*pauVar1 + 4);
          fVar106 = *(float *)(*pauVar1 + 8);
          fVar108 = *(float *)(*pauVar1 + 0xc);
          fVar109 = *(float *)(*pauVar1 + 0x10);
          fVar110 = *(float *)(*pauVar1 + 0x14);
          fVar111 = *(float *)(*pauVar1 + 0x18);
          auVar75 = *pauVar1;
          auVar193._0_4_ = local_4e0 * fVar85;
          auVar193._4_4_ = fStack_4dc * fVar104;
          auVar193._8_4_ = fStack_4d8 * fVar106;
          auVar193._12_4_ = fStack_4d4 * fVar108;
          auVar193._16_4_ = fStack_4d0 * fVar109;
          auVar193._20_4_ = fStack_4cc * fVar110;
          auVar193._28_36_ = auVar217._28_36_;
          auVar193._24_4_ = fStack_4c8 * fVar111;
          auVar217._0_4_ = fVar131 * fVar85;
          auVar217._4_4_ = fVar105 * fVar104;
          auVar217._8_4_ = fVar107 * fVar106;
          auVar217._12_4_ = fVar201 * fVar108;
          auVar217._16_4_ = fVar202 * fVar109;
          auVar217._20_4_ = fVar203 * fVar110;
          auVar217._28_36_ = auVar181._28_36_;
          auVar217._24_4_ = fVar161 * fVar111;
          auVar12 = vfmadd231ps_fma(auVar193._0_32_,local_7a0,auVar200._0_32_);
          auVar94 = auVar130._0_32_;
          auVar13 = vfmadd231ps_fma(auVar217._0_32_,local_7a0,auVar94);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar146,auVar182);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar146,local_500);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,auVar175);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,local_620);
          auVar157 = *(undefined1 (*) [32])(bezier_basis1 + lVar81 * 4 + lVar20);
          auVar100 = *(undefined1 (*) [32])(lVar20 + 0x21acb88 + lVar81 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar20 + 0x21ad00c + lVar81 * 4);
          pfVar2 = (float *)(lVar20 + 0x21ad490 + lVar81 * 4);
          fVar212 = *pfVar2;
          fVar218 = pfVar2[1];
          fVar226 = pfVar2[2];
          fVar227 = pfVar2[3];
          fVar228 = pfVar2[4];
          fVar73 = pfVar2[5];
          fVar74 = pfVar2[6];
          auVar76._4_4_ = fVar218 * fStack_4dc;
          auVar76._0_4_ = fVar212 * local_4e0;
          auVar76._8_4_ = fVar226 * fStack_4d8;
          auVar76._12_4_ = fVar227 * fStack_4d4;
          auVar76._16_4_ = fVar228 * fStack_4d0;
          auVar76._20_4_ = fVar73 * fStack_4cc;
          auVar76._24_4_ = fVar74 * fStack_4c8;
          auVar76._28_4_ = uVar204;
          auVar41._4_4_ = fVar218 * fVar105;
          auVar41._0_4_ = fVar212 * fVar131;
          auVar41._8_4_ = fVar226 * fVar107;
          auVar41._12_4_ = fVar227 * fVar201;
          auVar41._16_4_ = fVar228 * fVar202;
          auVar41._20_4_ = fVar73 * fVar203;
          auVar41._24_4_ = fVar74 * fVar161;
          auVar41._28_4_ = fStack_4c4;
          auVar14 = vfmadd231ps_fma(auVar76,auVar121,auVar200._0_32_);
          auVar15 = vfmadd231ps_fma(auVar41,auVar121,auVar94);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar100,auVar182);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar100,local_500);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar157,auVar175);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar157,local_620);
          local_540 = ZEXT1632(auVar14);
          local_440 = ZEXT1632(auVar12);
          auVar195 = vsubps_avx(local_540,local_440);
          local_6c0 = ZEXT1632(auVar15);
          auVar177 = ZEXT1632(auVar13);
          auVar10 = vsubps_avx(local_6c0,auVar177);
          auVar70._4_4_ = auVar195._4_4_ * auVar13._4_4_;
          auVar70._0_4_ = auVar195._0_4_ * auVar13._0_4_;
          auVar70._8_4_ = auVar195._8_4_ * auVar13._8_4_;
          auVar70._12_4_ = auVar195._12_4_ * auVar13._12_4_;
          auVar70._16_4_ = auVar195._16_4_ * 0.0;
          auVar70._20_4_ = auVar195._20_4_ * 0.0;
          auVar70._24_4_ = auVar195._24_4_ * 0.0;
          auVar70._28_4_ = local_500._28_4_;
          auVar181 = ZEXT3264(auVar94);
          fVar132 = auVar10._0_4_;
          auVar200._0_4_ = auVar12._0_4_ * fVar132;
          fVar131 = auVar10._4_4_;
          auVar200._4_4_ = auVar12._4_4_ * fVar131;
          fVar105 = auVar10._8_4_;
          auVar200._8_4_ = auVar12._8_4_ * fVar105;
          fVar107 = auVar10._12_4_;
          auVar200._12_4_ = auVar12._12_4_ * fVar107;
          fVar201 = auVar10._16_4_;
          auVar200._16_4_ = fVar201 * 0.0;
          fVar202 = auVar10._20_4_;
          auVar200._20_4_ = fVar202 * 0.0;
          fVar203 = auVar10._24_4_;
          auVar200._28_36_ = auVar130._28_36_;
          auVar200._24_4_ = fVar203 * 0.0;
          auVar217 = ZEXT3264(local_7a0);
          auVar149 = vsubps_avx(auVar70,auVar200._0_32_);
          auVar42._4_4_ = (float)local_260._4_4_ * fVar104;
          auVar42._0_4_ = (float)local_260._0_4_ * fVar85;
          auVar42._8_4_ = fStack_258 * fVar106;
          auVar42._12_4_ = fStack_254 * fVar108;
          auVar42._16_4_ = fStack_250 * fVar109;
          auVar42._20_4_ = fStack_24c * fVar110;
          auVar42._24_4_ = fStack_248 * fVar111;
          auVar42._28_4_ = local_500._28_4_;
          auVar12 = vfmadd231ps_fma(auVar42,local_7a0,local_a0);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_80,auVar146);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),local_240,auVar101);
          auVar43._4_4_ = fVar218 * (float)local_260._4_4_;
          auVar43._0_4_ = fVar212 * (float)local_260._0_4_;
          auVar43._8_4_ = fVar226 * fStack_258;
          auVar43._12_4_ = fVar227 * fStack_254;
          auVar43._16_4_ = fVar228 * fStack_250;
          auVar43._20_4_ = fVar73 * fStack_24c;
          auVar43._24_4_ = fVar74 * fStack_248;
          auVar43._28_4_ = uStack_244;
          auVar13 = vfmadd231ps_fma(auVar43,auVar121,local_a0);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar100,local_80);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar157,local_240);
          auVar44._4_4_ = fVar131 * fVar131;
          auVar44._0_4_ = fVar132 * fVar132;
          auVar44._8_4_ = fVar105 * fVar105;
          auVar44._12_4_ = fVar107 * fVar107;
          auVar44._16_4_ = fVar201 * fVar201;
          auVar44._20_4_ = fVar202 * fVar202;
          auVar44._24_4_ = fVar203 * fVar203;
          auVar44._28_4_ = local_240._28_4_;
          auVar14 = vfmadd231ps_fma(auVar44,auVar195,auVar195);
          auVar199 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
          auVar196._0_4_ = auVar199._0_4_ * auVar199._0_4_ * auVar14._0_4_;
          auVar196._4_4_ = auVar199._4_4_ * auVar199._4_4_ * auVar14._4_4_;
          auVar196._8_4_ = auVar199._8_4_ * auVar199._8_4_ * auVar14._8_4_;
          auVar196._12_4_ = auVar199._12_4_ * auVar199._12_4_ * auVar14._12_4_;
          auVar196._16_4_ = auVar199._16_4_ * auVar199._16_4_ * 0.0;
          auVar196._20_4_ = auVar199._20_4_ * auVar199._20_4_ * 0.0;
          auVar196._24_4_ = auVar199._24_4_ * auVar199._24_4_ * 0.0;
          auVar196._28_4_ = 0;
          auVar45._4_4_ = auVar149._4_4_ * auVar149._4_4_;
          auVar45._0_4_ = auVar149._0_4_ * auVar149._0_4_;
          auVar45._8_4_ = auVar149._8_4_ * auVar149._8_4_;
          auVar45._12_4_ = auVar149._12_4_ * auVar149._12_4_;
          auVar45._16_4_ = auVar149._16_4_ * auVar149._16_4_;
          auVar45._20_4_ = auVar149._20_4_ * auVar149._20_4_;
          auVar45._24_4_ = auVar149._24_4_ * auVar149._24_4_;
          auVar45._28_4_ = auVar149._28_4_;
          auVar199 = vcmpps_avx(auVar45,auVar196,2);
          local_380 = (int)lVar81;
          auVar197._4_4_ = local_380;
          auVar197._0_4_ = local_380;
          auVar197._8_4_ = local_380;
          auVar197._12_4_ = local_380;
          auVar197._16_4_ = local_380;
          auVar197._20_4_ = local_380;
          auVar197._24_4_ = local_380;
          auVar197._28_4_ = local_380;
          auVar149 = vpor_avx2(auVar197,_DAT_01fe9900);
          auVar17 = vpcmpgtd_avx2(local_5a0,auVar149);
          auVar149 = auVar17 & auVar199;
          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar149 >> 0x7f,0) == '\0') &&
                (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0xbf,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar149[0x1f]) {
            auVar200 = ZEXT3264(local_740);
          }
          else {
            local_5c0 = vandps_avx(auVar17,auVar199);
            auVar46._4_4_ = fVar218 * (float)local_6e0._4_4_;
            auVar46._0_4_ = fVar212 * (float)local_6e0._0_4_;
            auVar46._8_4_ = fVar226 * fStack_6d8;
            auVar46._12_4_ = fVar227 * fStack_6d4;
            auVar46._16_4_ = fVar228 * fStack_6d0;
            auVar46._20_4_ = fVar73 * fStack_6cc;
            auVar46._24_4_ = fVar74 * fStack_6c8;
            auVar46._28_4_ = auVar199._28_4_;
            auVar14 = vfmadd213ps_fma(auVar121,local_420,auVar46);
            auVar14 = vfmadd213ps_fma(auVar100,local_760,ZEXT1632(auVar14));
            auVar14 = vfmadd132ps_fma(auVar157,ZEXT1632(auVar14),local_780);
            local_580._0_4_ = auVar75._0_4_;
            local_580._4_4_ = auVar75._4_4_;
            fStack_578 = auVar75._8_4_;
            fStack_574 = auVar75._12_4_;
            fStack_570 = auVar75._16_4_;
            fStack_56c = auVar75._20_4_;
            fStack_568 = auVar75._24_4_;
            auVar158._0_4_ = (float)local_6e0._0_4_ * (float)local_580._0_4_;
            auVar158._4_4_ = (float)local_6e0._4_4_ * (float)local_580._4_4_;
            auVar158._8_4_ = fStack_6d8 * fStack_578;
            auVar158._12_4_ = fStack_6d4 * fStack_574;
            auVar158._16_4_ = fStack_6d0 * fStack_570;
            auVar158._20_4_ = fStack_6cc * fStack_56c;
            auVar158._24_4_ = fStack_6c8 * fStack_568;
            auVar158._28_4_ = 0;
            auVar15 = vfmadd213ps_fma(local_7a0,local_420,auVar158);
            auVar15 = vfmadd213ps_fma(auVar146,local_760,ZEXT1632(auVar15));
            auVar146 = *(undefined1 (*) [32])(lVar20 + 0x21ab4f4 + lVar81 * 4);
            auVar157 = *(undefined1 (*) [32])(lVar20 + 0x21ab978 + lVar81 * 4);
            auVar100 = *(undefined1 (*) [32])(lVar20 + 0x21abdfc + lVar81 * 4);
            pfVar2 = (float *)(lVar20 + 0x21ac280 + lVar81 * 4);
            fVar132 = *pfVar2;
            fVar131 = pfVar2[1];
            fVar105 = pfVar2[2];
            fVar107 = pfVar2[3];
            fVar201 = pfVar2[4];
            fVar202 = pfVar2[5];
            fVar203 = pfVar2[6];
            auVar47._4_4_ = fStack_4dc * fVar131;
            auVar47._0_4_ = local_4e0 * fVar132;
            auVar47._8_4_ = fStack_4d8 * fVar105;
            auVar47._12_4_ = fStack_4d4 * fVar107;
            auVar47._16_4_ = fStack_4d0 * fVar201;
            auVar47._20_4_ = fStack_4cc * fVar202;
            auVar47._24_4_ = fStack_4c8 * fVar203;
            auVar47._28_4_ = auVar195._28_4_;
            auVar215._0_4_ = (float)local_6a0 * fVar132;
            auVar215._4_4_ = local_6a0._4_4_ * fVar131;
            auVar215._8_4_ = (float)uStack_698 * fVar105;
            auVar215._12_4_ = uStack_698._4_4_ * fVar107;
            auVar215._16_4_ = (float)uStack_690 * fVar201;
            auVar215._20_4_ = uStack_690._4_4_ * fVar202;
            auVar215._24_4_ = (float)uStack_688 * fVar203;
            auVar215._28_4_ = 0;
            auVar48._4_4_ = fVar131 * (float)local_6e0._4_4_;
            auVar48._0_4_ = fVar132 * (float)local_6e0._0_4_;
            auVar48._8_4_ = fVar105 * fStack_6d8;
            auVar48._12_4_ = fVar107 * fStack_6d4;
            auVar48._16_4_ = fVar201 * fStack_6d0;
            auVar48._20_4_ = fVar202 * fStack_6cc;
            auVar48._24_4_ = fVar203 * fStack_6c8;
            auVar48._28_4_ = pfVar2[7];
            auVar16 = vfmadd231ps_fma(auVar47,auVar100,local_740);
            auVar90 = vfmadd231ps_fma(auVar215,auVar100,auVar94);
            auVar133 = vfmadd231ps_fma(auVar48,local_420,auVar100);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar157,auVar182);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar157,local_500);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),local_760,auVar157);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar146,auVar175);
            auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar146,local_620);
            auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar146,local_780);
            pfVar2 = (float *)(lVar20 + 0x21ae6a0 + lVar81 * 4);
            fVar132 = *pfVar2;
            fVar131 = pfVar2[1];
            fVar105 = pfVar2[2];
            fVar107 = pfVar2[3];
            fVar201 = pfVar2[4];
            fVar202 = pfVar2[5];
            fVar203 = pfVar2[6];
            auVar49._4_4_ = fStack_4dc * fVar131;
            auVar49._0_4_ = local_4e0 * fVar132;
            auVar49._8_4_ = fStack_4d8 * fVar105;
            auVar49._12_4_ = fStack_4d4 * fVar107;
            auVar49._16_4_ = fStack_4d0 * fVar201;
            auVar49._20_4_ = fStack_4cc * fVar202;
            auVar49._24_4_ = fStack_4c8 * fVar203;
            auVar49._28_4_ = fStack_4c4;
            auVar50._4_4_ = local_6a0._4_4_ * fVar131;
            auVar50._0_4_ = (float)local_6a0 * fVar132;
            auVar50._8_4_ = (float)uStack_698 * fVar105;
            auVar50._12_4_ = uStack_698._4_4_ * fVar107;
            auVar50._16_4_ = (float)uStack_690 * fVar201;
            auVar50._20_4_ = uStack_690._4_4_ * fVar202;
            auVar50._24_4_ = (float)uStack_688 * fVar203;
            auVar50._28_4_ = uStack_688._4_4_;
            auVar51._4_4_ = (float)local_6e0._4_4_ * fVar131;
            auVar51._0_4_ = (float)local_6e0._0_4_ * fVar132;
            auVar51._8_4_ = fStack_6d8 * fVar105;
            auVar51._12_4_ = fStack_6d4 * fVar107;
            auVar51._16_4_ = fStack_6d0 * fVar201;
            auVar51._20_4_ = fStack_6cc * fVar202;
            auVar51._24_4_ = fStack_6c8 * fVar203;
            auVar51._28_4_ = pfVar2[7];
            auVar146 = *(undefined1 (*) [32])(lVar20 + 0x21ae21c + lVar81 * 4);
            auVar114 = vfmadd231ps_fma(auVar49,auVar146,local_740);
            auVar88 = vfmadd231ps_fma(auVar50,auVar146,local_700);
            auVar115 = vfmadd231ps_fma(auVar51,local_420,auVar146);
            auVar146 = *(undefined1 (*) [32])(lVar20 + 0x21add98 + lVar81 * 4);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar146,auVar182);
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar146,local_500);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar146,local_760);
            auVar146 = *(undefined1 (*) [32])(lVar20 + 0x21ad914 + lVar81 * 4);
            auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar146,auVar175);
            auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar146,local_620);
            auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_780,auVar146);
            auVar198._8_4_ = 0x7fffffff;
            auVar198._0_8_ = 0x7fffffff7fffffff;
            auVar198._12_4_ = 0x7fffffff;
            auVar198._16_4_ = 0x7fffffff;
            auVar198._20_4_ = 0x7fffffff;
            auVar198._24_4_ = 0x7fffffff;
            auVar198._28_4_ = 0x7fffffff;
            auVar146 = vandps_avx(ZEXT1632(auVar16),auVar198);
            auVar157 = vandps_avx(ZEXT1632(auVar90),auVar198);
            auVar157 = vmaxps_avx(auVar146,auVar157);
            auVar146 = vandps_avx(ZEXT1632(auVar133),auVar198);
            auVar146 = vmaxps_avx(auVar157,auVar146);
            auVar146 = vcmpps_avx(auVar146,_local_460,1);
            auVar100 = vblendvps_avx(ZEXT1632(auVar16),auVar195,auVar146);
            auVar121 = vblendvps_avx(ZEXT1632(auVar90),auVar10,auVar146);
            auVar146 = vandps_avx(ZEXT1632(auVar114),auVar198);
            auVar157 = vandps_avx(ZEXT1632(auVar88),auVar198);
            auVar157 = vmaxps_avx(auVar146,auVar157);
            auVar146 = vandps_avx(auVar198,ZEXT1632(auVar115));
            auVar146 = vmaxps_avx(auVar157,auVar146);
            auVar157 = vcmpps_avx(auVar146,_local_460,1);
            auVar146 = vblendvps_avx(ZEXT1632(auVar114),auVar195,auVar157);
            auVar157 = vblendvps_avx(ZEXT1632(auVar88),auVar10,auVar157);
            auVar15 = vfmadd213ps_fma(auVar101,local_780,ZEXT1632(auVar15));
            auVar16 = vfmadd213ps_fma(auVar100,auVar100,ZEXT832(0) << 0x20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar121,auVar121);
            auVar101 = vrsqrtps_avx(ZEXT1632(auVar16));
            fVar132 = auVar101._0_4_;
            fVar131 = auVar101._4_4_;
            fVar105 = auVar101._8_4_;
            fVar107 = auVar101._12_4_;
            fVar201 = auVar101._16_4_;
            fVar202 = auVar101._20_4_;
            fVar203 = auVar101._24_4_;
            auVar52._4_4_ = fVar131 * fVar131 * fVar131 * auVar16._4_4_ * -0.5;
            auVar52._0_4_ = fVar132 * fVar132 * fVar132 * auVar16._0_4_ * -0.5;
            auVar52._8_4_ = fVar105 * fVar105 * fVar105 * auVar16._8_4_ * -0.5;
            auVar52._12_4_ = fVar107 * fVar107 * fVar107 * auVar16._12_4_ * -0.5;
            auVar52._16_4_ = fVar201 * fVar201 * fVar201 * -0.0;
            auVar52._20_4_ = fVar202 * fVar202 * fVar202 * -0.0;
            auVar52._24_4_ = fVar203 * fVar203 * fVar203 * -0.0;
            auVar52._28_4_ = 0;
            auVar224._8_4_ = 0x3fc00000;
            auVar224._0_8_ = 0x3fc000003fc00000;
            auVar224._12_4_ = 0x3fc00000;
            auVar224._16_4_ = 0x3fc00000;
            auVar224._20_4_ = 0x3fc00000;
            auVar224._24_4_ = 0x3fc00000;
            auVar224._28_4_ = 0x3fc00000;
            auVar16 = vfmadd231ps_fma(auVar52,auVar224,auVar101);
            fVar132 = auVar16._0_4_;
            fVar131 = auVar16._4_4_;
            auVar53._4_4_ = auVar121._4_4_ * fVar131;
            auVar53._0_4_ = auVar121._0_4_ * fVar132;
            fVar105 = auVar16._8_4_;
            auVar53._8_4_ = auVar121._8_4_ * fVar105;
            fVar107 = auVar16._12_4_;
            auVar53._12_4_ = auVar121._12_4_ * fVar107;
            auVar53._16_4_ = auVar121._16_4_ * 0.0;
            auVar53._20_4_ = auVar121._20_4_ * 0.0;
            auVar53._24_4_ = auVar121._24_4_ * 0.0;
            auVar53._28_4_ = auVar101._28_4_;
            auVar54._4_4_ = fVar131 * -auVar100._4_4_;
            auVar54._0_4_ = fVar132 * -auVar100._0_4_;
            auVar54._8_4_ = fVar105 * -auVar100._8_4_;
            auVar54._12_4_ = fVar107 * -auVar100._12_4_;
            auVar54._16_4_ = -auVar100._16_4_ * 0.0;
            auVar54._20_4_ = -auVar100._20_4_ * 0.0;
            auVar54._24_4_ = -auVar100._24_4_ * 0.0;
            auVar54._28_4_ = auVar121._28_4_;
            auVar16 = vfmadd213ps_fma(auVar146,auVar146,ZEXT832(0) << 0x20);
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar157,auVar157);
            auVar101 = vrsqrtps_avx(ZEXT1632(auVar16));
            auVar55._28_4_ = local_740._28_4_;
            auVar55._0_28_ =
                 ZEXT1628(CONCAT412(fVar107 * 0.0,
                                    CONCAT48(fVar105 * 0.0,CONCAT44(fVar131 * 0.0,fVar132 * 0.0))));
            fVar132 = auVar101._0_4_;
            fVar131 = auVar101._4_4_;
            fVar105 = auVar101._8_4_;
            fVar107 = auVar101._12_4_;
            fVar201 = auVar101._16_4_;
            fVar202 = auVar101._20_4_;
            fVar203 = auVar101._24_4_;
            auVar56._4_4_ = fVar131 * fVar131 * fVar131 * auVar16._4_4_ * -0.5;
            auVar56._0_4_ = fVar132 * fVar132 * fVar132 * auVar16._0_4_ * -0.5;
            auVar56._8_4_ = fVar105 * fVar105 * fVar105 * auVar16._8_4_ * -0.5;
            auVar56._12_4_ = fVar107 * fVar107 * fVar107 * auVar16._12_4_ * -0.5;
            auVar56._16_4_ = fVar201 * fVar201 * fVar201 * -0.0;
            auVar56._20_4_ = fVar202 * fVar202 * fVar202 * -0.0;
            auVar56._24_4_ = fVar203 * fVar203 * fVar203 * -0.0;
            auVar56._28_4_ = 0;
            auVar16 = vfmadd231ps_fma(auVar56,auVar224,auVar101);
            fVar132 = auVar16._0_4_;
            auVar219._0_4_ = auVar157._0_4_ * fVar132;
            fVar131 = auVar16._4_4_;
            auVar219._4_4_ = auVar157._4_4_ * fVar131;
            fVar105 = auVar16._8_4_;
            auVar219._8_4_ = auVar157._8_4_ * fVar105;
            fVar107 = auVar16._12_4_;
            auVar219._12_4_ = auVar157._12_4_ * fVar107;
            auVar219._16_4_ = auVar157._16_4_ * 0.0;
            auVar219._20_4_ = auVar157._20_4_ * 0.0;
            auVar219._24_4_ = auVar157._24_4_ * 0.0;
            auVar219._28_4_ = 0;
            auVar57._4_4_ = fVar131 * -auVar146._4_4_;
            auVar57._0_4_ = fVar132 * -auVar146._0_4_;
            auVar57._8_4_ = fVar105 * -auVar146._8_4_;
            auVar57._12_4_ = fVar107 * -auVar146._12_4_;
            auVar57._16_4_ = -auVar146._16_4_ * 0.0;
            auVar57._20_4_ = -auVar146._20_4_ * 0.0;
            auVar57._24_4_ = -auVar146._24_4_ * 0.0;
            auVar57._28_4_ = auVar101._28_4_;
            auVar58._28_4_ = 0xbf000000;
            auVar58._0_28_ =
                 ZEXT1628(CONCAT412(fVar107 * 0.0,
                                    CONCAT48(fVar105 * 0.0,CONCAT44(fVar131 * 0.0,fVar132 * 0.0))));
            auVar16 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar12),local_440);
            auVar101 = ZEXT1632(auVar12);
            auVar90 = vfmadd213ps_fma(auVar54,auVar101,auVar177);
            auVar133 = vfmadd213ps_fma(auVar55,auVar101,ZEXT1632(auVar15));
            auVar115 = vfnmadd213ps_fma(auVar53,auVar101,local_440);
            auVar114 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar13),local_540);
            auVar163 = vfnmadd213ps_fma(auVar54,auVar101,auVar177);
            auVar101 = ZEXT1632(auVar13);
            auVar88 = vfmadd213ps_fma(auVar57,auVar101,local_6c0);
            local_560 = ZEXT1632(auVar12);
            auVar12 = vfnmadd231ps_fma(ZEXT1632(auVar15),local_560,auVar55);
            auVar15 = vfmadd213ps_fma(auVar58,auVar101,ZEXT1632(auVar14));
            auVar87 = vfnmadd213ps_fma(auVar219,auVar101,local_540);
            auVar113 = vfnmadd213ps_fma(auVar57,auVar101,local_6c0);
            auVar162 = vfnmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),auVar58);
            auVar101 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar163));
            auVar146 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar12));
            auVar59._4_4_ = auVar101._4_4_ * auVar12._4_4_;
            auVar59._0_4_ = auVar101._0_4_ * auVar12._0_4_;
            auVar59._8_4_ = auVar101._8_4_ * auVar12._8_4_;
            auVar59._12_4_ = auVar101._12_4_ * auVar12._12_4_;
            auVar59._16_4_ = auVar101._16_4_ * 0.0;
            auVar59._20_4_ = auVar101._20_4_ * 0.0;
            auVar59._24_4_ = auVar101._24_4_ * 0.0;
            auVar59._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar163),auVar146);
            auVar60._4_4_ = auVar115._4_4_ * auVar146._4_4_;
            auVar60._0_4_ = auVar115._0_4_ * auVar146._0_4_;
            auVar60._8_4_ = auVar115._8_4_ * auVar146._8_4_;
            auVar60._12_4_ = auVar115._12_4_ * auVar146._12_4_;
            auVar60._16_4_ = auVar146._16_4_ * 0.0;
            auVar60._20_4_ = auVar146._20_4_ * 0.0;
            auVar60._24_4_ = auVar146._24_4_ * 0.0;
            auVar60._28_4_ = auVar146._28_4_;
            auVar199 = ZEXT1632(auVar115);
            auVar146 = vsubps_avx(ZEXT1632(auVar114),auVar199);
            auVar149 = ZEXT1632(auVar12);
            auVar12 = vfmsub231ps_fma(auVar60,auVar149,auVar146);
            auVar61._4_4_ = auVar163._4_4_ * auVar146._4_4_;
            auVar61._0_4_ = auVar163._0_4_ * auVar146._0_4_;
            auVar61._8_4_ = auVar163._8_4_ * auVar146._8_4_;
            auVar61._12_4_ = auVar163._12_4_ * auVar146._12_4_;
            auVar61._16_4_ = auVar146._16_4_ * 0.0;
            auVar61._20_4_ = auVar146._20_4_ * 0.0;
            auVar61._24_4_ = auVar146._24_4_ * 0.0;
            auVar61._28_4_ = auVar146._28_4_;
            auVar115 = vfmsub231ps_fma(auVar61,auVar199,auVar101);
            auVar101 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar101,ZEXT1632(auVar12));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar101,ZEXT1632(auVar14));
            auVar17 = vcmpps_avx(ZEXT1632(auVar12),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar101 = vblendvps_avx(ZEXT1632(auVar87),ZEXT1632(auVar16),auVar17);
            auVar146 = vblendvps_avx(ZEXT1632(auVar113),ZEXT1632(auVar90),auVar17);
            local_7a0 = vblendvps_avx(ZEXT1632(auVar162),ZEXT1632(auVar133),auVar17);
            auVar217 = ZEXT3264(local_7a0);
            auVar157 = vblendvps_avx(auVar199,ZEXT1632(auVar114),auVar17);
            auVar100 = vblendvps_avx(ZEXT1632(auVar163),ZEXT1632(auVar88),auVar17);
            auVar121 = vblendvps_avx(auVar149,ZEXT1632(auVar15),auVar17);
            auVar199 = vblendvps_avx(ZEXT1632(auVar114),auVar199,auVar17);
            auVar10 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar163),auVar17);
            auVar12 = vpackssdw_avx(local_5c0._0_16_,local_5c0._16_16_);
            auVar149 = vblendvps_avx(ZEXT1632(auVar15),auVar149,auVar17);
            auVar199 = vsubps_avx(auVar199,auVar101);
            auVar10 = vsubps_avx(auVar10,auVar146);
            auVar94 = vsubps_avx(auVar149,local_7a0);
            auVar177 = vsubps_avx(auVar101,auVar157);
            auVar18 = vsubps_avx(auVar146,auVar100);
            auVar19 = vsubps_avx(local_7a0,auVar121);
            auVar178._0_4_ = auVar94._0_4_ * auVar101._0_4_;
            auVar178._4_4_ = auVar94._4_4_ * auVar101._4_4_;
            auVar178._8_4_ = auVar94._8_4_ * auVar101._8_4_;
            auVar178._12_4_ = auVar94._12_4_ * auVar101._12_4_;
            auVar178._16_4_ = auVar94._16_4_ * auVar101._16_4_;
            auVar178._20_4_ = auVar94._20_4_ * auVar101._20_4_;
            auVar178._24_4_ = auVar94._24_4_ * auVar101._24_4_;
            auVar178._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar178,local_7a0,auVar199);
            auVar62._4_4_ = auVar199._4_4_ * auVar146._4_4_;
            auVar62._0_4_ = auVar199._0_4_ * auVar146._0_4_;
            auVar62._8_4_ = auVar199._8_4_ * auVar146._8_4_;
            auVar62._12_4_ = auVar199._12_4_ * auVar146._12_4_;
            auVar62._16_4_ = auVar199._16_4_ * auVar146._16_4_;
            auVar62._20_4_ = auVar199._20_4_ * auVar146._20_4_;
            auVar62._24_4_ = auVar199._24_4_ * auVar146._24_4_;
            auVar62._28_4_ = auVar149._28_4_;
            auVar15 = vfmsub231ps_fma(auVar62,auVar101,auVar10);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar179._0_4_ = local_7a0._0_4_ * auVar10._0_4_;
            auVar179._4_4_ = local_7a0._4_4_ * auVar10._4_4_;
            auVar179._8_4_ = local_7a0._8_4_ * auVar10._8_4_;
            auVar179._12_4_ = local_7a0._12_4_ * auVar10._12_4_;
            auVar179._16_4_ = local_7a0._16_4_ * auVar10._16_4_;
            auVar179._20_4_ = local_7a0._20_4_ * auVar10._20_4_;
            auVar179._24_4_ = local_7a0._24_4_ * auVar10._24_4_;
            auVar179._28_4_ = 0;
            auVar15 = vfmsub231ps_fma(auVar179,auVar146,auVar94);
            auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
            auVar180._0_4_ = auVar19._0_4_ * auVar157._0_4_;
            auVar180._4_4_ = auVar19._4_4_ * auVar157._4_4_;
            auVar180._8_4_ = auVar19._8_4_ * auVar157._8_4_;
            auVar180._12_4_ = auVar19._12_4_ * auVar157._12_4_;
            auVar180._16_4_ = auVar19._16_4_ * auVar157._16_4_;
            auVar180._20_4_ = auVar19._20_4_ * auVar157._20_4_;
            auVar180._24_4_ = auVar19._24_4_ * auVar157._24_4_;
            auVar180._28_4_ = 0;
            auVar14 = vfmsub231ps_fma(auVar180,auVar177,auVar121);
            auVar63._4_4_ = auVar18._4_4_ * auVar121._4_4_;
            auVar63._0_4_ = auVar18._0_4_ * auVar121._0_4_;
            auVar63._8_4_ = auVar18._8_4_ * auVar121._8_4_;
            auVar63._12_4_ = auVar18._12_4_ * auVar121._12_4_;
            auVar63._16_4_ = auVar18._16_4_ * auVar121._16_4_;
            auVar63._20_4_ = auVar18._20_4_ * auVar121._20_4_;
            auVar63._24_4_ = auVar18._24_4_ * auVar121._24_4_;
            auVar63._28_4_ = auVar121._28_4_;
            auVar16 = vfmsub231ps_fma(auVar63,auVar100,auVar19);
            auVar64._4_4_ = auVar177._4_4_ * auVar100._4_4_;
            auVar64._0_4_ = auVar177._0_4_ * auVar100._0_4_;
            auVar64._8_4_ = auVar177._8_4_ * auVar100._8_4_;
            auVar64._12_4_ = auVar177._12_4_ * auVar100._12_4_;
            auVar64._16_4_ = auVar177._16_4_ * auVar100._16_4_;
            auVar64._20_4_ = auVar177._20_4_ * auVar100._20_4_;
            auVar64._24_4_ = auVar177._24_4_ * auVar100._24_4_;
            auVar64._28_4_ = auVar100._28_4_;
            auVar90 = vfmsub231ps_fma(auVar64,auVar18,auVar157);
            auVar14 = vfmadd231ps_fma(ZEXT1632(auVar90),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
            auVar157 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
            auVar157 = vcmpps_avx(auVar157,ZEXT832(0) << 0x20,2);
            auVar14 = vpackssdw_avx(auVar157._0_16_,auVar157._16_16_);
            auVar12 = vpand_avx(auVar14,auVar12);
            auVar157 = vpmovsxwd_avx2(auVar12);
            auVar181 = ZEXT3264(auVar157);
            if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar157 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar157 >> 0x7f,0) == '\0') &&
                  (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar157 >> 0xbf,0) == '\0') &&
                (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar157[0x1f]) {
LAB_015f3758:
              auVar160._8_8_ = local_660[1]._8_8_;
              auVar160._0_8_ = local_660[1]._0_8_;
              auVar160._16_8_ = local_660[1]._16_8_;
              auVar160._24_8_ = local_660[1]._24_8_;
            }
            else {
              auVar65._4_4_ = auVar19._4_4_ * auVar10._4_4_;
              auVar65._0_4_ = auVar19._0_4_ * auVar10._0_4_;
              auVar65._8_4_ = auVar19._8_4_ * auVar10._8_4_;
              auVar65._12_4_ = auVar19._12_4_ * auVar10._12_4_;
              auVar65._16_4_ = auVar19._16_4_ * auVar10._16_4_;
              auVar65._20_4_ = auVar19._20_4_ * auVar10._20_4_;
              auVar65._24_4_ = auVar19._24_4_ * auVar10._24_4_;
              auVar65._28_4_ = auVar157._28_4_;
              auVar114 = vfmsub231ps_fma(auVar65,auVar18,auVar94);
              auVar183._0_4_ = auVar94._0_4_ * auVar177._0_4_;
              auVar183._4_4_ = auVar94._4_4_ * auVar177._4_4_;
              auVar183._8_4_ = auVar94._8_4_ * auVar177._8_4_;
              auVar183._12_4_ = auVar94._12_4_ * auVar177._12_4_;
              auVar183._16_4_ = auVar94._16_4_ * auVar177._16_4_;
              auVar183._20_4_ = auVar94._20_4_ * auVar177._20_4_;
              auVar183._24_4_ = auVar94._24_4_ * auVar177._24_4_;
              auVar183._28_4_ = 0;
              auVar133 = vfmsub231ps_fma(auVar183,auVar199,auVar19);
              auVar66._4_4_ = auVar199._4_4_ * auVar18._4_4_;
              auVar66._0_4_ = auVar199._0_4_ * auVar18._0_4_;
              auVar66._8_4_ = auVar199._8_4_ * auVar18._8_4_;
              auVar66._12_4_ = auVar199._12_4_ * auVar18._12_4_;
              auVar66._16_4_ = auVar199._16_4_ * auVar18._16_4_;
              auVar66._20_4_ = auVar199._20_4_ * auVar18._20_4_;
              auVar66._24_4_ = auVar199._24_4_ * auVar18._24_4_;
              auVar66._28_4_ = auVar18._28_4_;
              auVar88 = vfmsub231ps_fma(auVar66,auVar177,auVar10);
              auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar133),ZEXT1632(auVar88));
              auVar90 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar114),ZEXT832(0) << 0x20);
              auVar157 = vrcpps_avx(ZEXT1632(auVar90));
              auVar216._8_4_ = 0x3f800000;
              auVar216._0_8_ = 0x3f8000003f800000;
              auVar216._12_4_ = 0x3f800000;
              auVar216._16_4_ = 0x3f800000;
              auVar216._20_4_ = 0x3f800000;
              auVar216._24_4_ = 0x3f800000;
              auVar216._28_4_ = 0x3f800000;
              auVar217 = ZEXT3264(auVar216);
              auVar14 = vfnmadd213ps_fma(auVar157,ZEXT1632(auVar90),auVar216);
              auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar157,auVar157);
              auVar67._4_4_ = auVar88._4_4_ * local_7a0._4_4_;
              auVar67._0_4_ = auVar88._0_4_ * local_7a0._0_4_;
              auVar67._8_4_ = auVar88._8_4_ * local_7a0._8_4_;
              auVar67._12_4_ = auVar88._12_4_ * local_7a0._12_4_;
              auVar67._16_4_ = local_7a0._16_4_ * 0.0;
              auVar67._20_4_ = local_7a0._20_4_ * 0.0;
              auVar67._24_4_ = local_7a0._24_4_ * 0.0;
              auVar67._28_4_ = auVar10._28_4_;
              auVar133 = vfmadd231ps_fma(auVar67,ZEXT1632(auVar133),auVar146);
              auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),ZEXT1632(auVar114),auVar101);
              fVar132 = auVar14._0_4_;
              fVar131 = auVar14._4_4_;
              fVar105 = auVar14._8_4_;
              fVar107 = auVar14._12_4_;
              auVar157 = ZEXT1632(CONCAT412(fVar107 * auVar133._12_4_,
                                            CONCAT48(fVar105 * auVar133._8_4_,
                                                     CONCAT44(fVar131 * auVar133._4_4_,
                                                              fVar132 * auVar133._0_4_))));
              auVar181 = ZEXT3264(auVar157);
              uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar159._4_4_ = uVar112;
              auVar159._0_4_ = uVar112;
              auVar159._8_4_ = uVar112;
              auVar159._12_4_ = uVar112;
              auVar159._16_4_ = uVar112;
              auVar159._20_4_ = uVar112;
              auVar159._24_4_ = uVar112;
              auVar159._28_4_ = uVar112;
              auVar101 = vcmpps_avx(local_480,auVar157,2);
              auVar146 = vcmpps_avx(auVar157,auVar159,2);
              auVar101 = vandps_avx(auVar146,auVar101);
              auVar14 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
              auVar12 = vpand_avx(auVar12,auVar14);
              auVar101 = vpmovsxwd_avx2(auVar12);
              if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar101 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar101 >> 0x7f,0) == '\0') &&
                    (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar101 >> 0xbf,0) == '\0') &&
                  (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar101[0x1f]) goto LAB_015f3758;
              auVar101 = vcmpps_avx(ZEXT1632(auVar90),ZEXT832(0) << 0x20,4);
              auVar14 = vpackssdw_avx(auVar101._0_16_,auVar101._16_16_);
              auVar12 = vpand_avx(auVar12,auVar14);
              auVar101 = vpmovsxwd_avx2(auVar12);
              auVar160._8_8_ = local_660[1]._8_8_;
              auVar160._0_8_ = local_660[1]._0_8_;
              auVar160._16_8_ = local_660[1]._16_8_;
              auVar160._24_8_ = local_660[1]._24_8_;
              if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar101 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar101 >> 0x7f,0) != '\0') ||
                    (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar101 >> 0xbf,0) != '\0') ||
                  (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar101[0x1f] < '\0') {
                auVar100 = ZEXT1632(CONCAT412(fVar107 * auVar15._12_4_,
                                              CONCAT48(fVar105 * auVar15._8_4_,
                                                       CONCAT44(fVar131 * auVar15._4_4_,
                                                                fVar132 * auVar15._0_4_))));
                auVar68._28_4_ = SUB84(local_660[1]._24_8_,4);
                auVar68._0_28_ =
                     ZEXT1628(CONCAT412(fVar107 * auVar16._12_4_,
                                        CONCAT48(fVar105 * auVar16._8_4_,
                                                 CONCAT44(fVar131 * auVar16._4_4_,
                                                          fVar132 * auVar16._0_4_))));
                auVar192._8_4_ = 0x3f800000;
                auVar192._0_8_ = 0x3f8000003f800000;
                auVar192._12_4_ = 0x3f800000;
                auVar192._16_4_ = 0x3f800000;
                auVar192._20_4_ = 0x3f800000;
                auVar192._24_4_ = 0x3f800000;
                auVar192._28_4_ = 0x3f800000;
                auVar146 = vsubps_avx(auVar192,auVar100);
                local_c0 = vblendvps_avx(auVar146,auVar100,auVar17);
                auVar146 = vsubps_avx(auVar192,auVar68);
                local_4c0 = vblendvps_avx(auVar146,auVar68,auVar17);
                auVar160 = auVar101;
                local_600 = auVar157;
              }
            }
            auVar200 = ZEXT3264(local_740);
            auVar94 = local_700;
            if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0x7f,0) != '\0') ||
                  (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0xbf,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar160[0x1f] < '\0') {
              auVar101 = vsubps_avx(ZEXT1632(auVar13),local_560);
              auVar12 = vfmadd213ps_fma(auVar101,local_c0,local_560);
              fVar132 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar69._4_4_ = (auVar12._4_4_ + auVar12._4_4_) * fVar132;
              auVar69._0_4_ = (auVar12._0_4_ + auVar12._0_4_) * fVar132;
              auVar69._8_4_ = (auVar12._8_4_ + auVar12._8_4_) * fVar132;
              auVar69._12_4_ = (auVar12._12_4_ + auVar12._12_4_) * fVar132;
              auVar69._16_4_ = fVar132 * 0.0;
              auVar69._20_4_ = fVar132 * 0.0;
              auVar69._24_4_ = fVar132 * 0.0;
              auVar69._28_4_ = fVar132;
              auVar101 = vcmpps_avx(local_600,auVar69,6);
              auVar146 = auVar160 & auVar101;
              if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar146 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar146 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar146 >> 0x7f,0) != '\0') ||
                    (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar146 >> 0xbf,0) != '\0') ||
                  (auVar146 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar146[0x1f] < '\0') {
                auVar124._8_4_ = 0xbf800000;
                auVar124._0_8_ = 0xbf800000bf800000;
                auVar124._12_4_ = 0xbf800000;
                auVar124._16_4_ = 0xbf800000;
                auVar124._20_4_ = 0xbf800000;
                auVar124._24_4_ = 0xbf800000;
                auVar124._28_4_ = 0xbf800000;
                auVar150._8_4_ = 0x40000000;
                auVar150._0_8_ = 0x4000000040000000;
                auVar150._12_4_ = 0x40000000;
                auVar150._16_4_ = 0x40000000;
                auVar150._20_4_ = 0x40000000;
                auVar150._24_4_ = 0x40000000;
                auVar150._28_4_ = 0x40000000;
                auVar12 = vfmadd213ps_fma(local_4c0,auVar150,auVar124);
                auVar181 = ZEXT1664(auVar12);
                local_3e0 = local_c0;
                local_3c0 = ZEXT1632(auVar12);
                local_3a0 = local_600;
                local_370 = local_7e0;
                uStack_368 = uStack_7d8;
                local_360 = local_870;
                uStack_358 = uStack_868;
                local_350 = local_880;
                uStack_348 = uStack_878;
                local_340 = local_7f0;
                uStack_338 = uStack_7e8;
                pGVar8 = (context->scene->geometries).items[uVar6].ptr;
                local_4c0 = local_3c0;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_680 = vandps_avx(auVar101,auVar160);
                  fVar132 = (float)local_380;
                  local_300[0] = (fVar132 + local_c0._0_4_ + 0.0) * local_100;
                  local_300[1] = (fVar132 + local_c0._4_4_ + 1.0) * fStack_fc;
                  local_300[2] = (fVar132 + local_c0._8_4_ + 2.0) * fStack_f8;
                  local_300[3] = (fVar132 + local_c0._12_4_ + 3.0) * fStack_f4;
                  fStack_2f0 = (fVar132 + local_c0._16_4_ + 4.0) * fStack_f0;
                  fStack_2ec = (fVar132 + local_c0._20_4_ + 5.0) * fStack_ec;
                  fStack_2e8 = (fVar132 + local_c0._24_4_ + 6.0) * fStack_e8;
                  fStack_2e4 = fVar132 + local_c0._28_4_ + 7.0;
                  local_4c0._0_8_ = auVar12._0_8_;
                  local_4c0._8_8_ = auVar12._8_8_;
                  local_2e0 = local_4c0._0_8_;
                  uStack_2d8 = local_4c0._8_8_;
                  uStack_2d0 = 0;
                  uStack_2c8 = 0;
                  local_2c0 = local_600;
                  auVar125._8_4_ = 0x7f800000;
                  auVar125._0_8_ = 0x7f8000007f800000;
                  auVar125._12_4_ = 0x7f800000;
                  auVar125._16_4_ = 0x7f800000;
                  auVar125._20_4_ = 0x7f800000;
                  auVar125._24_4_ = 0x7f800000;
                  auVar125._28_4_ = 0x7f800000;
                  auVar101 = vblendvps_avx(auVar125,local_600,local_680);
                  auVar146 = vshufps_avx(auVar101,auVar101,0xb1);
                  auVar146 = vminps_avx(auVar101,auVar146);
                  auVar157 = vshufpd_avx(auVar146,auVar146,5);
                  auVar146 = vminps_avx(auVar146,auVar157);
                  auVar157 = vpermpd_avx2(auVar146,0x4e);
                  auVar146 = vminps_avx(auVar146,auVar157);
                  auVar146 = vcmpps_avx(auVar101,auVar146,0);
                  auVar157 = local_680 & auVar146;
                  auVar101 = local_680;
                  if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar157 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar157 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar157 >> 0x7f,0) != '\0') ||
                        (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar157 >> 0xbf,0) != '\0') ||
                      (auVar157 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar157[0x1f] < '\0') {
                    auVar101 = vandps_avx(auVar146,local_680);
                  }
                  uVar79 = vmovmskps_avx(auVar101);
                  uVar82 = 0;
                  for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                    uVar82 = uVar82 + 1;
                  }
                  uVar80 = (ulong)uVar82;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar132 = local_300[uVar80];
                    uVar112 = *(undefined4 *)((long)&local_2e0 + uVar80 * 4);
                    fVar105 = 1.0 - fVar132;
                    fVar131 = fVar105 * fVar105 * -3.0;
                    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105)),
                                              ZEXT416((uint)(fVar132 * fVar105)),ZEXT416(0xc0000000)
                                             );
                    auVar13 = vfmsub132ss_fma(ZEXT416((uint)(fVar132 * fVar105)),
                                              ZEXT416((uint)(fVar132 * fVar132)),ZEXT416(0x40000000)
                                             );
                    fVar105 = auVar12._0_4_ * 3.0;
                    fVar107 = auVar13._0_4_ * 3.0;
                    fVar201 = fVar132 * fVar132 * 3.0;
                    auVar172._0_4_ = fVar201 * fVar71;
                    auVar172._4_4_ = fVar201 * fVar72;
                    auVar172._8_4_ = fVar201 * fVar220;
                    auVar172._12_4_ = fVar201 * fVar225;
                    auVar181 = ZEXT1664(auVar172);
                    auVar138._4_4_ = fVar107;
                    auVar138._0_4_ = fVar107;
                    auVar138._8_4_ = fVar107;
                    auVar138._12_4_ = fVar107;
                    auVar12 = vfmadd132ps_fma(auVar138,auVar172,auVar89);
                    auVar156._4_4_ = fVar105;
                    auVar156._0_4_ = fVar105;
                    auVar156._8_4_ = fVar105;
                    auVar156._12_4_ = fVar105;
                    auVar12 = vfmadd132ps_fma(auVar156,auVar12,auVar153);
                    auVar139._4_4_ = fVar131;
                    auVar139._0_4_ = fVar131;
                    auVar139._8_4_ = fVar131;
                    auVar139._12_4_ = fVar131;
                    auVar12 = vfmadd132ps_fma(auVar139,auVar12,auVar11);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar80 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar12._0_4_;
                    uVar187 = vextractps_avx(auVar12,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar187;
                    uVar187 = vextractps_avx(auVar12,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar187;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar132;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar112;
                    *(uint *)(ray + k * 4 + 0x220) = uVar7;
                    *(uint *)(ray + k * 4 + 0x240) = uVar6;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_718 = context;
                    _local_580 = auVar195;
                    local_37c = iVar78;
                    while( true ) {
                      local_1c0 = local_300[uVar80];
                      local_1a0 = *(undefined4 *)((long)&local_2e0 + uVar80 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar80 * 4)
                      ;
                      fVar105 = 1.0 - local_1c0;
                      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105)),
                                                ZEXT416((uint)(local_1c0 * fVar105)),
                                                ZEXT416(0xc0000000));
                      auVar12 = vfmsub132ss_fma(ZEXT416((uint)(local_1c0 * fVar105)),
                                                ZEXT416((uint)(local_1c0 * local_1c0)),
                                                ZEXT416(0x40000000));
                      fVar132 = auVar12._0_4_ * 3.0;
                      fVar131 = local_1c0 * local_1c0 * 3.0;
                      auVar173._0_4_ = fVar131 * fVar71;
                      auVar173._4_4_ = fVar131 * fVar72;
                      auVar173._8_4_ = fVar131 * fVar220;
                      auVar173._12_4_ = fVar131 * fVar225;
                      auVar181 = ZEXT1664(auVar173);
                      auVar140._4_4_ = fVar132;
                      auVar140._0_4_ = fVar132;
                      auVar140._8_4_ = fVar132;
                      auVar140._12_4_ = fVar132;
                      auVar12 = vfmadd132ps_fma(auVar140,auVar173,auVar89);
                      fVar132 = auVar13._0_4_ * 3.0;
                      auVar164._4_4_ = fVar132;
                      auVar164._0_4_ = fVar132;
                      auVar164._8_4_ = fVar132;
                      auVar164._12_4_ = fVar132;
                      auVar12 = vfmadd132ps_fma(auVar164,auVar12,auVar153);
                      fVar132 = fVar105 * fVar105 * -3.0;
                      local_7d0.context = context->user;
                      auVar141._4_4_ = fVar132;
                      auVar141._0_4_ = fVar132;
                      auVar141._8_4_ = fVar132;
                      auVar141._12_4_ = fVar132;
                      auVar13 = vfmadd132ps_fma(auVar141,auVar12,auVar11);
                      local_220 = auVar13._0_4_;
                      uStack_21c = local_220;
                      uStack_218 = local_220;
                      uStack_214 = local_220;
                      uStack_210 = local_220;
                      uStack_20c = local_220;
                      uStack_208 = local_220;
                      uStack_204 = local_220;
                      auVar12 = vmovshdup_avx(auVar13);
                      local_200 = auVar12._0_8_;
                      uStack_1f8 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1e8 = local_200;
                      auVar12 = vshufps_avx(auVar13,auVar13,0xaa);
                      auVar142._0_8_ = auVar12._0_8_;
                      auVar142._8_8_ = auVar142._0_8_;
                      auVar151._16_8_ = auVar142._0_8_;
                      auVar151._0_16_ = auVar142;
                      auVar151._24_8_ = auVar142._0_8_;
                      local_1e0 = auVar151;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = CONCAT44(uStack_dc,local_e0);
                      uStack_178 = CONCAT44(uStack_d4,uStack_d8);
                      uStack_170 = CONCAT44(uStack_cc,uStack_d0);
                      uStack_168 = CONCAT44(uStack_c4,uStack_c8);
                      local_160._4_4_ = uStack_51c;
                      local_160._0_4_ = local_520;
                      local_160._8_4_ = uStack_518;
                      local_160._12_4_ = uStack_514;
                      local_160._16_4_ = uStack_510;
                      local_160._20_4_ = uStack_50c;
                      local_160._24_4_ = uStack_508;
                      local_160._28_4_ = uStack_504;
                      auVar101 = vpcmpeqd_avx2(local_160,local_160);
                      local_708[1] = auVar101;
                      *local_708 = auVar101;
                      local_140 = (local_7d0.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_7d0.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_660[0] = local_2a0;
                      local_7d0.valid = (int *)local_660;
                      local_7d0.geometryUserPtr = pGVar8->userPtr;
                      local_7d0.hit = (RTCHitN *)&local_220;
                      local_7d0.N = 8;
                      local_7d0.ray = (RTCRayN *)ray;
                      if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar151 = ZEXT1632(auVar142);
                        auVar181 = ZEXT1664(auVar173);
                        auVar217 = ZEXT1664(auVar217._0_16_);
                        (*pGVar8->intersectionFilterN)(&local_7d0);
                        context = local_718;
                      }
                      auVar146 = vpcmpeqd_avx2(local_660[0],_DAT_01faff00);
                      auVar157 = vpcmpeqd_avx2(auVar151,auVar151);
                      auVar101 = auVar157 & ~auVar146;
                      if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar101 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar101 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar101 >> 0x7f,0) == '\0') &&
                            (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar101 >> 0xbf,0) == '\0') &&
                          (auVar101 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar101[0x1f]) {
                        auVar146 = auVar146 ^ auVar157;
                      }
                      else {
                        p_Var9 = context->args->filter;
                        if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar157 = ZEXT1632(auVar157._0_16_);
                          auVar181 = ZEXT1664(auVar181._0_16_);
                          auVar217 = ZEXT1664(auVar217._0_16_);
                          (*p_Var9)(&local_7d0);
                          context = local_718;
                        }
                        auVar100 = vpcmpeqd_avx2(local_660[0],
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar157 = vpcmpeqd_avx2(auVar157,auVar157);
                        auVar146 = auVar100 ^ auVar157;
                        auVar101 = auVar157 & ~auVar100;
                        if ((((((((auVar101 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar101 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar101 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar101 >> 0x7f,0) != '\0')
                              || (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar101 >> 0xbf,0) != '\0') ||
                            (auVar101 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar101[0x1f] < '\0') {
                          auVar126._0_4_ = auVar100._0_4_ ^ auVar157._0_4_;
                          auVar126._4_4_ = auVar100._4_4_ ^ auVar157._4_4_;
                          auVar126._8_4_ = auVar100._8_4_ ^ auVar157._8_4_;
                          auVar126._12_4_ = auVar100._12_4_ ^ auVar157._12_4_;
                          auVar126._16_4_ = auVar100._16_4_ ^ auVar157._16_4_;
                          auVar126._20_4_ = auVar100._20_4_ ^ auVar157._20_4_;
                          auVar126._24_4_ = auVar100._24_4_ ^ auVar157._24_4_;
                          auVar126._28_4_ = auVar100._28_4_ ^ auVar157._28_4_;
                          auVar101 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])local_7d0.hit);
                          *(undefined1 (*) [32])(local_7d0.ray + 0x180) = auVar101;
                          auVar101 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x20));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1a0) = auVar101;
                          auVar101 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x40));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1c0) = auVar101;
                          auVar101 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x60));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x1e0) = auVar101;
                          auVar101 = vmaskmovps_avx(auVar126,*(undefined1 (*) [32])
                                                              (local_7d0.hit + 0x80));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x200) = auVar101;
                          auVar101 = vpmaskmovd_avx2(auVar126,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x220) = auVar101;
                          auVar101 = vpmaskmovd_avx2(auVar126,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x240) = auVar101;
                          auVar101 = vpmaskmovd_avx2(auVar126,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x260) = auVar101;
                          auVar101 = vpmaskmovd_avx2(auVar126,*(undefined1 (*) [32])
                                                               (local_7d0.hit + 0x100));
                          *(undefined1 (*) [32])(local_7d0.ray + 0x280) = auVar101;
                        }
                      }
                      auVar101 = local_600;
                      if ((((((((auVar146 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar146 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar146 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar146 >> 0x7f,0) == '\0') &&
                            (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar146 >> 0xbf,0) == '\0') &&
                          (auVar146 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar146[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar112;
                      }
                      else {
                        uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_680 + uVar80 * 4) = 0;
                      auVar102._4_4_ = uVar112;
                      auVar102._0_4_ = uVar112;
                      auVar102._8_4_ = uVar112;
                      auVar102._12_4_ = uVar112;
                      auVar102._16_4_ = uVar112;
                      auVar102._20_4_ = uVar112;
                      auVar102._24_4_ = uVar112;
                      auVar102._28_4_ = uVar112;
                      auVar157 = vcmpps_avx(auVar101,auVar102,2);
                      auVar146 = vandps_avx(auVar157,local_680);
                      local_680 = local_680 & auVar157;
                      if ((((((((local_680 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_680 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_680 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_680 >> 0x7f,0) == '\0') &&
                            (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_680 >> 0xbf,0) == '\0') &&
                          (local_680 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_680[0x1f]) break;
                      auVar127._8_4_ = 0x7f800000;
                      auVar127._0_8_ = 0x7f8000007f800000;
                      auVar127._12_4_ = 0x7f800000;
                      auVar127._16_4_ = 0x7f800000;
                      auVar127._20_4_ = 0x7f800000;
                      auVar127._24_4_ = 0x7f800000;
                      auVar127._28_4_ = 0x7f800000;
                      auVar101 = vblendvps_avx(auVar127,auVar101,auVar146);
                      auVar157 = vshufps_avx(auVar101,auVar101,0xb1);
                      auVar157 = vminps_avx(auVar101,auVar157);
                      auVar100 = vshufpd_avx(auVar157,auVar157,5);
                      auVar157 = vminps_avx(auVar157,auVar100);
                      auVar100 = vpermpd_avx2(auVar157,0x4e);
                      auVar157 = vminps_avx(auVar157,auVar100);
                      auVar157 = vcmpps_avx(auVar101,auVar157,0);
                      auVar100 = auVar146 & auVar157;
                      auVar101 = auVar146;
                      if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar100 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar100 >> 0x7f,0) != '\0') ||
                            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar100 >> 0xbf,0) != '\0') ||
                          (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar100[0x1f] < '\0') {
                        auVar101 = vandps_avx(auVar157,auVar146);
                      }
                      uVar79 = vmovmskps_avx(auVar101);
                      uVar82 = 0;
                      for (; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x80000000) {
                        uVar82 = uVar82 + 1;
                      }
                      uVar80 = (ulong)uVar82;
                      local_680 = auVar146;
                    }
                    auVar200 = ZEXT3264(local_740);
                    auVar94 = local_700;
                  }
                }
              }
            }
          }
          auVar130 = ZEXT3264(auVar94);
          lVar81 = lVar81 + 8;
          fVar131 = (float)local_6a0;
          fVar105 = local_6a0._4_4_;
          fVar107 = (float)uStack_698;
          fVar201 = uStack_698._4_4_;
          fVar202 = (float)uStack_690;
          fVar203 = uStack_690._4_4_;
          fVar161 = (float)uStack_688;
        } while ((int)lVar81 < iVar78);
      }
      uVar112 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar92._4_4_ = uVar112;
      auVar92._0_4_ = uVar112;
      auVar92._8_4_ = uVar112;
      auVar92._12_4_ = uVar112;
      auVar11 = vcmpps_avx(local_400,auVar92,2);
      uVar82 = vmovmskps_avx(auVar11);
      uVar77 = uVar77 & uVar77 + 0xf & uVar82;
    } while (uVar77 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }